

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_h<embree::sse2::SweepCurve1Intersector1<embree::HermiteCurveT>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  RTCRayQueryFlags *pRVar5;
  RTCRayQueryFlags *pRVar6;
  float *pfVar7;
  Primitive *pPVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined4 uVar18;
  Primitive PVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  Geometry *pGVar26;
  __int_type_conflict _Var27;
  long lVar28;
  RTCFilterFunctionN p_Var29;
  long lVar30;
  long lVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined6 uVar92;
  undefined1 auVar93 [12];
  unkbyte9 Var94;
  undefined1 auVar95 [13];
  undefined1 auVar96 [12];
  undefined1 auVar97 [13];
  undefined1 auVar98 [12];
  undefined1 auVar99 [13];
  undefined1 auVar100 [12];
  undefined1 auVar101 [12];
  undefined1 auVar102 [12];
  undefined1 auVar103 [13];
  undefined1 auVar104 [12];
  undefined1 auVar105 [13];
  undefined1 auVar106 [12];
  undefined1 auVar107 [13];
  undefined1 auVar108 [12];
  undefined1 auVar109 [12];
  undefined1 auVar110 [12];
  undefined1 auVar111 [12];
  undefined1 auVar112 [12];
  undefined1 auVar113 [12];
  undefined1 auVar114 [12];
  undefined1 auVar115 [12];
  undefined1 auVar116 [12];
  undefined1 auVar117 [15];
  undefined1 auVar118 [15];
  undefined1 auVar119 [15];
  undefined1 auVar120 [15];
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  undefined1 auVar124 [13];
  undefined1 auVar125 [15];
  undefined4 uVar126;
  ulong uVar127;
  long lVar128;
  StackEntry *pSVar129;
  RTCRayN *pRVar130;
  RTCRayN *extraout_RAX;
  RTCRayN *extraout_RAX_00;
  undefined4 uVar132;
  RTCIntersectArguments *pRVar133;
  RTCIntersectArguments *pRVar134;
  RTCIntersectArguments *extraout_RDX;
  RTCIntersectArguments *extraout_RDX_00;
  RTCIntersectArguments *extraout_RDX_01;
  RTCIntersectArguments *pRVar135;
  RTCIntersectArguments *extraout_RDX_02;
  RTCIntersectArguments *extraout_RDX_03;
  RTCIntersectArguments *extraout_RDX_04;
  RTCIntersectArguments *pRVar136;
  RTCIntersectArguments *pRVar137;
  long lVar138;
  bool bVar139;
  uint uVar140;
  uint uVar141;
  uint uVar142;
  uint uVar143;
  uint uVar144;
  uint uVar145;
  short sVar146;
  float fVar147;
  undefined2 uVar193;
  int iVar148;
  undefined1 auVar150 [12];
  int iVar194;
  __m128 a_1;
  char cVar197;
  undefined1 auVar152 [16];
  undefined1 auVar156 [16];
  undefined1 auVar151 [12];
  undefined1 auVar160 [16];
  float fVar198;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar168 [16];
  undefined1 auVar171 [16];
  undefined1 auVar174 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  char cVar262;
  undefined1 uVar263;
  float pp;
  float fVar199;
  undefined1 auVar201 [12];
  undefined8 uVar200;
  undefined1 auVar206 [16];
  char cVar268;
  undefined1 auVar210 [16];
  undefined1 auVar202 [12];
  undefined1 auVar214 [16];
  undefined1 auVar203 [12];
  undefined1 auVar218 [16];
  float fVar267;
  float fVar269;
  undefined1 auVar221 [16];
  undefined1 auVar204 [12];
  undefined1 auVar224 [16];
  undefined1 auVar205 [12];
  undefined1 auVar228 [16];
  undefined1 auVar232 [16];
  undefined1 auVar235 [16];
  undefined1 auVar238 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  float fVar270;
  float fVar284;
  float fVar286;
  undefined1 auVar273 [16];
  float fVar285;
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar287;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  char cVar311;
  float fVar288;
  undefined1 auVar289 [12];
  float fVar312;
  float fVar313;
  float fVar314;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  float fVar315;
  float fVar322;
  float fVar323;
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar320 [16];
  undefined1 auVar324 [16];
  float fVar335;
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar331 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  float fVar336;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  float fVar347;
  undefined1 auVar348 [12];
  float fVar358;
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar354 [16];
  float fVar359;
  float fVar360;
  float fVar361;
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  float fVar369;
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar367;
  undefined1 auVar368 [16];
  float fVar370;
  float fVar377;
  float fVar379;
  undefined1 auVar371 [16];
  float fVar378;
  float fVar380;
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  float fVar381;
  float fVar384;
  float fVar386;
  undefined1 auVar382 [16];
  float fVar385;
  float fVar387;
  float fVar388;
  float fVar389;
  undefined1 auVar383 [16];
  float fVar390;
  float fVar391;
  float fVar392;
  float fVar393;
  float fVar396;
  float fVar399;
  vfloat4 a;
  float fVar397;
  float fVar400;
  float fVar402;
  undefined1 auVar394 [16];
  float fVar398;
  float fVar401;
  float fVar403;
  undefined1 auVar395 [16];
  float fVar404;
  float fVar405;
  float fVar406;
  float fVar412;
  float fVar415;
  undefined1 auVar407 [16];
  float fVar413;
  float fVar414;
  float fVar416;
  float fVar417;
  float fVar418;
  float fVar419;
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar410;
  undefined1 auVar411 [16];
  float fVar424;
  __m128 a_2;
  float fVar425;
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  float fVar426;
  float fVar427;
  float fVar428;
  float fVar435;
  float fVar438;
  float fVar441;
  undefined1 auVar429 [16];
  float fVar436;
  float fVar437;
  float fVar439;
  float fVar440;
  float fVar442;
  float fVar443;
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  float fVar444;
  float fVar445;
  float fVar446;
  float fVar447;
  float fVar448;
  float fVar449;
  float fVar450;
  float fVar451;
  float fVar452;
  float fVar453;
  float fVar454;
  float local_5ec;
  undefined1 local_5d8 [8];
  float fStack_5d0;
  float fStack_5cc;
  undefined1 local_5c8 [8];
  float fStack_5c0;
  float fStack_5bc;
  undefined1 local_578 [8];
  float fStack_570;
  float fStack_56c;
  undefined1 local_548 [8];
  float fStack_540;
  float fStack_53c;
  RTCFilterFunctionNArguments args;
  int local_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  vfloatx vu0;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_348 [16];
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [16];
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [16];
  Primitive *local_2e8;
  ulong local_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [16];
  BBox<embree::vfloat_impl<4>_> tp1;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  BBox<embree::vfloat_impl<4>_> tp0;
  float local_118 [4];
  undefined1 local_108 [16];
  StackEntry stack [4];
  ulong uVar131;
  undefined1 auVar149 [12];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar153 [16];
  undefined1 auVar157 [16];
  undefined1 auVar161 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar162 [16];
  int iVar195;
  int iVar196;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar225 [16];
  undefined1 auVar229 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar211 [16];
  undefined1 auVar215 [16];
  undefined1 auVar219 [16];
  undefined1 auVar226 [16];
  undefined1 auVar230 [16];
  undefined1 auVar209 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar220 [16];
  undefined1 auVar227 [16];
  undefined1 auVar231 [16];
  int iVar264;
  int iVar265;
  int iVar266;
  undefined1 auVar271 [12];
  undefined1 auVar274 [16];
  undefined1 auVar272 [16];
  undefined1 auVar275 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar319 [16];
  undefined1 auVar321 [16];
  undefined1 auVar330 [16];
  undefined1 auVar332 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  
  PVar19 = prim[1];
  uVar127 = (ulong)(byte)PVar19;
  lVar138 = uVar127 * 0x25;
  uVar132 = *(undefined4 *)(prim + uVar127 * 4 + 6);
  uVar126 = *(undefined4 *)(prim + uVar127 * 5 + 6);
  uVar20 = *(undefined4 *)(prim + uVar127 * 6 + 6);
  uVar21 = *(undefined4 *)(prim + uVar127 * 0xf + 6);
  uVar22 = *(undefined4 *)(prim + (ulong)(byte)PVar19 * 0x10 + 6);
  uVar23 = *(undefined4 *)(prim + uVar127 * 0x11 + 6);
  uVar24 = *(undefined4 *)(prim + uVar127 * 0x1a + 6);
  uVar25 = *(undefined4 *)(prim + uVar127 * 0x1b + 6);
  pPVar8 = prim + lVar138 + 6;
  fVar399 = *(float *)(pPVar8 + 0xc);
  fVar147 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar138 + 0x16)) *
            *(float *)(prim + lVar138 + 0x1a);
  fVar444 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar8) * fVar399;
  fVar447 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar8 + 4)) * fVar399;
  fVar450 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar8 + 8)) * fVar399;
  fVar390 = fVar399 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar396 = fVar399 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar399 = fVar399 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar193 = CONCAT11((char)((uint)uVar126 >> 0x18),(char)((uint)fVar147 >> 0x18));
  uVar200 = CONCAT35(CONCAT21(uVar193,(char)((uint)uVar126 >> 0x10)),
                     CONCAT14((char)((uint)fVar147 >> 0x10),fVar147));
  cVar268 = (char)((uint)uVar126 >> 8);
  uVar92 = CONCAT51(CONCAT41((int)((ulong)uVar200 >> 0x20),cVar268),(char)((uint)fVar147 >> 8));
  cVar262 = (char)uVar126;
  sVar146 = CONCAT11(cVar262,SUB41(fVar147,0));
  uVar131 = CONCAT62(uVar92,sVar146);
  auVar164._8_4_ = 0;
  auVar164._0_8_ = uVar131;
  auVar164._12_2_ = uVar193;
  auVar164._14_2_ = uVar193;
  uVar193 = (undefined2)((ulong)uVar200 >> 0x20);
  auVar277._12_4_ = auVar164._12_4_;
  auVar277._8_2_ = 0;
  auVar277._0_8_ = uVar131;
  auVar277._10_2_ = uVar193;
  auVar326._10_6_ = auVar277._10_6_;
  auVar326._8_2_ = uVar193;
  auVar326._0_8_ = uVar131;
  uVar193 = (undefined2)uVar92;
  auVar93._4_8_ = auVar326._8_8_;
  auVar93._2_2_ = uVar193;
  auVar93._0_2_ = uVar193;
  iVar148 = (int)sVar146 >> 8;
  iVar194 = auVar93._0_4_ >> 0x18;
  auVar149._0_8_ = CONCAT44(iVar194,iVar148);
  auVar149._8_4_ = auVar326._8_4_ >> 0x18;
  auVar338._12_4_ = auVar277._12_4_ >> 0x18;
  auVar338._0_12_ = auVar149;
  fVar343 = (float)iVar194;
  cVar197 = cVar268 >> 7;
  auVar35[0xd] = 0;
  auVar35._0_13_ = auVar338._0_13_;
  auVar35[0xe] = cVar197;
  auVar41[0xc] = cVar197;
  auVar41._0_12_ = auVar149;
  auVar41._13_2_ = auVar35._13_2_;
  auVar47[0xb] = 0;
  auVar47._0_11_ = auVar149._0_11_;
  auVar47._12_3_ = auVar41._12_3_;
  auVar53[10] = cVar197;
  auVar53._0_10_ = auVar149._0_10_;
  auVar53._11_4_ = auVar47._11_4_;
  auVar59[9] = 0;
  auVar59._0_9_ = auVar149._0_9_;
  auVar59._10_5_ = auVar53._10_5_;
  auVar65[8] = cVar268;
  auVar65._0_8_ = auVar149._0_8_;
  auVar65._9_6_ = auVar59._9_6_;
  Var94 = CONCAT81(CONCAT71(auVar65._8_7_,(char)((uint)uVar20 >> 0x18)),(short)cVar262 >> 7);
  auVar71._6_9_ = Var94;
  auVar71[5] = (char)((uint)uVar20 >> 0x10);
  auVar71[4] = (undefined1)((short)cVar262 >> 7);
  auVar71._0_4_ = iVar148;
  cVar311 = (char)((uint)uVar20 >> 8);
  auVar95._2_11_ = auVar71._4_11_;
  auVar95[1] = cVar311;
  auVar95[0] = (undefined1)((short)cVar262 >> 7);
  cVar268 = (char)uVar20;
  auVar77._2_13_ = auVar95;
  auVar77._0_2_ = CONCAT11(cVar268,cVar262);
  uVar193 = (undefined2)Var94;
  auVar154._0_12_ = auVar77._0_12_;
  auVar154._12_2_ = uVar193;
  auVar154._14_2_ = uVar193;
  auVar153._12_4_ = auVar154._12_4_;
  auVar153._0_10_ = auVar77._0_10_;
  auVar153._10_2_ = auVar71._4_2_;
  auVar152._10_6_ = auVar153._10_6_;
  auVar152._0_8_ = auVar77._0_8_;
  auVar152._8_2_ = auVar71._4_2_;
  auVar96._4_8_ = auVar152._8_8_;
  auVar96._2_2_ = auVar95._0_2_;
  auVar96._0_2_ = auVar95._0_2_;
  iVar194 = (int)CONCAT11(cVar268,cVar262) >> 8;
  iVar195 = auVar96._0_4_ >> 0x18;
  auVar150._0_8_ = CONCAT44(iVar195,iVar194);
  auVar150._8_4_ = auVar152._8_4_ >> 0x18;
  auVar155._12_4_ = auVar153._12_4_ >> 0x18;
  auVar155._0_12_ = auVar150;
  fVar384 = (float)iVar195;
  cVar197 = cVar311 >> 7;
  auVar36[0xd] = 0;
  auVar36._0_13_ = auVar155._0_13_;
  auVar36[0xe] = cVar197;
  auVar42[0xc] = cVar197;
  auVar42._0_12_ = auVar150;
  auVar42._13_2_ = auVar36._13_2_;
  auVar48[0xb] = 0;
  auVar48._0_11_ = auVar150._0_11_;
  auVar48._12_3_ = auVar42._12_3_;
  auVar54[10] = cVar197;
  auVar54._0_10_ = auVar150._0_10_;
  auVar54._11_4_ = auVar48._11_4_;
  auVar60[9] = 0;
  auVar60._0_9_ = auVar150._0_9_;
  auVar60._10_5_ = auVar54._10_5_;
  auVar66[8] = cVar311;
  auVar66._0_8_ = auVar150._0_8_;
  auVar66._9_6_ = auVar60._9_6_;
  Var94 = CONCAT81(CONCAT71(auVar66._8_7_,(char)((uint)uVar22 >> 0x18)),(short)cVar268 >> 7);
  auVar72._6_9_ = Var94;
  auVar72[5] = (char)((uint)uVar22 >> 0x10);
  auVar72[4] = (undefined1)((short)cVar268 >> 7);
  auVar72._0_4_ = iVar194;
  cVar311 = (char)((uint)uVar22 >> 8);
  auVar97._2_11_ = auVar72._4_11_;
  auVar97[1] = cVar311;
  auVar97[0] = (undefined1)((short)cVar268 >> 7);
  cVar262 = (char)uVar22;
  auVar78._2_13_ = auVar97;
  auVar78._0_2_ = CONCAT11(cVar262,cVar268);
  uVar193 = (undefined2)Var94;
  auVar158._0_12_ = auVar78._0_12_;
  auVar158._12_2_ = uVar193;
  auVar158._14_2_ = uVar193;
  auVar157._12_4_ = auVar158._12_4_;
  auVar157._0_10_ = auVar78._0_10_;
  auVar157._10_2_ = auVar72._4_2_;
  auVar156._10_6_ = auVar157._10_6_;
  auVar156._0_8_ = auVar78._0_8_;
  auVar156._8_2_ = auVar72._4_2_;
  auVar98._4_8_ = auVar156._8_8_;
  auVar98._2_2_ = auVar97._0_2_;
  auVar98._0_2_ = auVar97._0_2_;
  iVar195 = (int)CONCAT11(cVar262,cVar268) >> 8;
  iVar196 = auVar98._0_4_ >> 0x18;
  auVar151._0_8_ = CONCAT44(iVar196,iVar195);
  auVar151._8_4_ = auVar156._8_4_ >> 0x18;
  auVar159._12_4_ = auVar157._12_4_ >> 0x18;
  auVar159._0_12_ = auVar151;
  fVar358 = (float)iVar196;
  cVar197 = cVar311 >> 7;
  auVar37[0xd] = 0;
  auVar37._0_13_ = auVar159._0_13_;
  auVar37[0xe] = cVar197;
  auVar43[0xc] = cVar197;
  auVar43._0_12_ = auVar151;
  auVar43._13_2_ = auVar37._13_2_;
  auVar49[0xb] = 0;
  auVar49._0_11_ = auVar151._0_11_;
  auVar49._12_3_ = auVar43._12_3_;
  auVar55[10] = cVar197;
  auVar55._0_10_ = auVar151._0_10_;
  auVar55._11_4_ = auVar49._11_4_;
  auVar61[9] = 0;
  auVar61._0_9_ = auVar151._0_9_;
  auVar61._10_5_ = auVar55._10_5_;
  auVar67[8] = cVar311;
  auVar67._0_8_ = auVar151._0_8_;
  auVar67._9_6_ = auVar61._9_6_;
  Var94 = CONCAT81(CONCAT71(auVar67._8_7_,(char)((uint)uVar23 >> 0x18)),(short)cVar262 >> 7);
  auVar73._6_9_ = Var94;
  auVar73[5] = (char)((uint)uVar23 >> 0x10);
  auVar73[4] = (undefined1)((short)cVar262 >> 7);
  auVar73._0_4_ = iVar195;
  auVar99._2_11_ = auVar73._4_11_;
  auVar99[1] = (char)((uint)uVar23 >> 8);
  auVar99[0] = (undefined1)((short)cVar262 >> 7);
  sVar146 = CONCAT11((char)uVar23,cVar262);
  auVar79._2_13_ = auVar99;
  auVar79._0_2_ = sVar146;
  uVar193 = (undefined2)Var94;
  auVar162._0_12_ = auVar79._0_12_;
  auVar162._12_2_ = uVar193;
  auVar162._14_2_ = uVar193;
  auVar161._12_4_ = auVar162._12_4_;
  auVar161._0_10_ = auVar79._0_10_;
  auVar161._10_2_ = auVar73._4_2_;
  auVar160._10_6_ = auVar161._10_6_;
  auVar160._0_8_ = auVar79._0_8_;
  auVar160._8_2_ = auVar73._4_2_;
  auVar100._4_8_ = auVar160._8_8_;
  auVar100._2_2_ = auVar99._0_2_;
  auVar100._0_2_ = auVar99._0_2_;
  fVar404 = (float)((int)sVar146 >> 8);
  fVar412 = (float)(auVar100._0_4_ >> 0x18);
  fVar415 = (float)(auVar160._8_4_ >> 0x18);
  fVar270 = fVar399 * (float)iVar194;
  fVar284 = fVar399 * fVar384;
  auVar271._0_8_ = CONCAT44(fVar284,fVar270);
  auVar271._8_4_ = fVar399 * (float)auVar150._8_4_;
  auVar272._12_4_ = fVar399 * (float)auVar155._12_4_;
  auVar272._0_12_ = auVar271;
  uVar126 = *(undefined4 *)(prim + uVar127 * 0x1c + 6);
  local_5c8[0] = (undefined1)uVar132;
  local_5c8[1] = (undefined1)((uint)uVar132 >> 8);
  local_5c8[2] = (undefined1)((uint)uVar132 >> 0x10);
  local_5c8[3] = (undefined1)((uint)uVar132 >> 0x18);
  auVar117[0xd] = 0;
  auVar117._0_13_ = auVar272._0_13_;
  auVar117[0xe] = (char)((uint)fVar284 >> 0x18);
  auVar118[0xc] = (char)((uint)fVar284 >> 0x10);
  auVar118._0_12_ = auVar271;
  auVar118._13_2_ = auVar117._13_2_;
  auVar119[0xb] = 0;
  auVar119._0_11_ = auVar271._0_11_;
  auVar119._12_3_ = auVar118._12_3_;
  auVar120[10] = (char)((uint)fVar284 >> 8);
  auVar120._0_10_ = auVar271._0_10_;
  auVar120._11_4_ = auVar119._11_4_;
  auVar121[9] = 0;
  auVar121._0_9_ = auVar271._0_9_;
  auVar121._10_5_ = auVar120._10_5_;
  auVar122[8] = SUB41(fVar284,0);
  auVar122._0_8_ = auVar271._0_8_;
  auVar122._9_6_ = auVar121._9_6_;
  Var94 = CONCAT81(CONCAT71(auVar122._8_7_,local_5c8[3]),(char)((uint)fVar270 >> 0x18));
  auVar123._6_9_ = Var94;
  auVar123[5] = local_5c8[2];
  auVar123[4] = (char)((uint)fVar270 >> 0x10);
  auVar123._0_4_ = fVar270;
  auVar124._2_11_ = auVar123._4_11_;
  auVar124[1] = local_5c8[1];
  auVar124[0] = (char)((uint)fVar270 >> 8);
  sVar146 = CONCAT11(local_5c8[0],SUB41(fVar270,0));
  auVar125._2_13_ = auVar124;
  auVar125._0_2_ = sVar146;
  uVar193 = (undefined2)Var94;
  auVar275._0_12_ = auVar125._0_12_;
  auVar275._12_2_ = uVar193;
  auVar275._14_2_ = uVar193;
  auVar274._12_4_ = auVar275._12_4_;
  auVar274._0_10_ = auVar125._0_10_;
  auVar274._10_2_ = auVar123._4_2_;
  auVar273._10_6_ = auVar274._10_6_;
  auVar273._0_8_ = auVar125._0_8_;
  auVar273._8_2_ = auVar123._4_2_;
  auVar101._4_8_ = auVar273._8_8_;
  auVar101._2_2_ = auVar124._0_2_;
  auVar101._0_2_ = auVar124._0_2_;
  fVar315 = (float)((int)sVar146 >> 8);
  fVar322 = (float)(auVar101._0_4_ >> 0x18);
  fVar323 = (float)(auVar273._8_4_ >> 0x18);
  uVar263 = (undefined1)((uint)uVar21 >> 0x18);
  uVar193 = CONCAT11(uVar263,uVar263);
  uVar263 = (undefined1)((uint)uVar21 >> 0x10);
  uVar200 = CONCAT35(CONCAT21(uVar193,uVar263),CONCAT14(uVar263,uVar21));
  cVar262 = (char)((uint)uVar21 >> 8);
  uVar92 = CONCAT51(CONCAT41((int)((ulong)uVar200 >> 0x20),cVar262),cVar262);
  cVar197 = (char)uVar21;
  uVar131 = CONCAT62(uVar92,CONCAT11(cVar197,cVar197));
  auVar208._8_4_ = 0;
  auVar208._0_8_ = uVar131;
  auVar208._12_2_ = uVar193;
  auVar208._14_2_ = uVar193;
  uVar193 = (undefined2)((ulong)uVar200 >> 0x20);
  auVar207._12_4_ = auVar208._12_4_;
  auVar207._8_2_ = 0;
  auVar207._0_8_ = uVar131;
  auVar207._10_2_ = uVar193;
  auVar206._10_6_ = auVar207._10_6_;
  auVar206._8_2_ = uVar193;
  auVar206._0_8_ = uVar131;
  uVar193 = (undefined2)uVar92;
  auVar102._4_8_ = auVar206._8_8_;
  auVar102._2_2_ = uVar193;
  auVar102._0_2_ = uVar193;
  iVar196 = (int)CONCAT11(cVar197,cVar197) >> 8;
  iVar264 = auVar102._0_4_ >> 0x18;
  auVar201._0_8_ = CONCAT44(iVar264,iVar196);
  auVar201._8_4_ = auVar206._8_4_ >> 0x18;
  auVar209._12_4_ = auVar207._12_4_ >> 0x18;
  auVar209._0_12_ = auVar201;
  fVar285 = (float)iVar264;
  cVar268 = cVar262 >> 7;
  auVar38[0xd] = 0;
  auVar38._0_13_ = auVar209._0_13_;
  auVar38[0xe] = cVar268;
  auVar44[0xc] = cVar268;
  auVar44._0_12_ = auVar201;
  auVar44._13_2_ = auVar38._13_2_;
  auVar50[0xb] = 0;
  auVar50._0_11_ = auVar201._0_11_;
  auVar50._12_3_ = auVar44._12_3_;
  auVar56[10] = cVar268;
  auVar56._0_10_ = auVar201._0_10_;
  auVar56._11_4_ = auVar50._11_4_;
  auVar62[9] = 0;
  auVar62._0_9_ = auVar201._0_9_;
  auVar62._10_5_ = auVar56._10_5_;
  auVar68[8] = cVar262;
  auVar68._0_8_ = auVar201._0_8_;
  auVar68._9_6_ = auVar62._9_6_;
  Var94 = CONCAT81(CONCAT71(auVar68._8_7_,(char)((uint)uVar24 >> 0x18)),(short)cVar197 >> 7);
  auVar74._6_9_ = Var94;
  auVar74[5] = (char)((uint)uVar24 >> 0x10);
  auVar74[4] = (undefined1)((short)cVar197 >> 7);
  auVar74._0_4_ = iVar196;
  cVar268 = (char)((uint)uVar24 >> 8);
  auVar103._2_11_ = auVar74._4_11_;
  auVar103[1] = cVar268;
  auVar103[0] = (undefined1)((short)cVar197 >> 7);
  cVar262 = (char)uVar24;
  auVar80._2_13_ = auVar103;
  auVar80._0_2_ = CONCAT11(cVar262,cVar197);
  uVar193 = (undefined2)Var94;
  auVar212._0_12_ = auVar80._0_12_;
  auVar212._12_2_ = uVar193;
  auVar212._14_2_ = uVar193;
  auVar211._12_4_ = auVar212._12_4_;
  auVar211._0_10_ = auVar80._0_10_;
  auVar211._10_2_ = auVar74._4_2_;
  auVar210._10_6_ = auVar211._10_6_;
  auVar210._0_8_ = auVar80._0_8_;
  auVar210._8_2_ = auVar74._4_2_;
  auVar104._4_8_ = auVar210._8_8_;
  auVar104._2_2_ = auVar103._0_2_;
  auVar104._0_2_ = auVar103._0_2_;
  iVar264 = (int)CONCAT11(cVar262,cVar197) >> 8;
  iVar265 = auVar104._0_4_ >> 0x18;
  auVar202._0_8_ = CONCAT44(iVar265,iVar264);
  auVar202._8_4_ = auVar210._8_4_ >> 0x18;
  auVar213._12_4_ = auVar211._12_4_ >> 0x18;
  auVar213._0_12_ = auVar202;
  fVar369 = (float)iVar265;
  cVar197 = cVar268 >> 7;
  auVar39[0xd] = 0;
  auVar39._0_13_ = auVar213._0_13_;
  auVar39[0xe] = cVar197;
  auVar45[0xc] = cVar197;
  auVar45._0_12_ = auVar202;
  auVar45._13_2_ = auVar39._13_2_;
  auVar51[0xb] = 0;
  auVar51._0_11_ = auVar202._0_11_;
  auVar51._12_3_ = auVar45._12_3_;
  auVar57[10] = cVar197;
  auVar57._0_10_ = auVar202._0_10_;
  auVar57._11_4_ = auVar51._11_4_;
  auVar63[9] = 0;
  auVar63._0_9_ = auVar202._0_9_;
  auVar63._10_5_ = auVar57._10_5_;
  auVar69[8] = cVar268;
  auVar69._0_8_ = auVar202._0_8_;
  auVar69._9_6_ = auVar63._9_6_;
  Var94 = CONCAT81(CONCAT71(auVar69._8_7_,(char)((uint)uVar25 >> 0x18)),(short)cVar262 >> 7);
  auVar75._6_9_ = Var94;
  auVar75[5] = (char)((uint)uVar25 >> 0x10);
  auVar75[4] = (undefined1)((short)cVar262 >> 7);
  auVar75._0_4_ = iVar264;
  cVar311 = (char)((uint)uVar25 >> 8);
  auVar105._2_11_ = auVar75._4_11_;
  auVar105[1] = cVar311;
  auVar105[0] = (undefined1)((short)cVar262 >> 7);
  cVar268 = (char)uVar25;
  auVar81._2_13_ = auVar105;
  auVar81._0_2_ = CONCAT11(cVar268,cVar262);
  uVar193 = (undefined2)Var94;
  auVar216._0_12_ = auVar81._0_12_;
  auVar216._12_2_ = uVar193;
  auVar216._14_2_ = uVar193;
  auVar215._12_4_ = auVar216._12_4_;
  auVar215._0_10_ = auVar81._0_10_;
  auVar215._10_2_ = auVar75._4_2_;
  auVar214._10_6_ = auVar215._10_6_;
  auVar214._0_8_ = auVar81._0_8_;
  auVar214._8_2_ = auVar75._4_2_;
  auVar106._4_8_ = auVar214._8_8_;
  auVar106._2_2_ = auVar105._0_2_;
  auVar106._0_2_ = auVar105._0_2_;
  iVar265 = (int)CONCAT11(cVar268,cVar262) >> 8;
  iVar266 = auVar106._0_4_ >> 0x18;
  auVar203._0_8_ = CONCAT44(iVar266,iVar265);
  auVar203._8_4_ = auVar214._8_4_ >> 0x18;
  auVar217._12_4_ = auVar215._12_4_ >> 0x18;
  auVar217._0_12_ = auVar203;
  fVar377 = (float)iVar266;
  cVar197 = cVar311 >> 7;
  auVar40[0xd] = 0;
  auVar40._0_13_ = auVar217._0_13_;
  auVar40[0xe] = cVar197;
  auVar46[0xc] = cVar197;
  auVar46._0_12_ = auVar203;
  auVar46._13_2_ = auVar40._13_2_;
  auVar52[0xb] = 0;
  auVar52._0_11_ = auVar203._0_11_;
  auVar52._12_3_ = auVar46._12_3_;
  auVar58[10] = cVar197;
  auVar58._0_10_ = auVar203._0_10_;
  auVar58._11_4_ = auVar52._11_4_;
  auVar64[9] = 0;
  auVar64._0_9_ = auVar203._0_9_;
  auVar64._10_5_ = auVar58._10_5_;
  auVar70[8] = cVar311;
  auVar70._0_8_ = auVar203._0_8_;
  auVar70._9_6_ = auVar64._9_6_;
  Var94 = CONCAT81(CONCAT71(auVar70._8_7_,(char)((uint)uVar126 >> 0x18)),(short)cVar268 >> 7);
  auVar76._6_9_ = Var94;
  auVar76[5] = (char)((uint)uVar126 >> 0x10);
  auVar76[4] = (undefined1)((short)cVar268 >> 7);
  auVar76._0_4_ = iVar265;
  auVar107._2_11_ = auVar76._4_11_;
  auVar107[1] = (char)((uint)uVar126 >> 8);
  auVar107[0] = (undefined1)((short)cVar268 >> 7);
  sVar146 = CONCAT11((char)uVar126,cVar268);
  auVar82._2_13_ = auVar107;
  auVar82._0_2_ = sVar146;
  uVar193 = (undefined2)Var94;
  auVar220._0_12_ = auVar82._0_12_;
  auVar220._12_2_ = uVar193;
  auVar220._14_2_ = uVar193;
  auVar219._12_4_ = auVar220._12_4_;
  auVar219._0_10_ = auVar82._0_10_;
  auVar219._10_2_ = auVar76._4_2_;
  auVar218._10_6_ = auVar219._10_6_;
  auVar218._0_8_ = auVar82._0_8_;
  auVar218._8_2_ = auVar76._4_2_;
  auVar108._4_8_ = auVar218._8_8_;
  auVar108._2_2_ = auVar107._0_2_;
  auVar108._0_2_ = auVar107._0_2_;
  fVar199 = (float)((int)sVar146 >> 8);
  fVar267 = (float)(auVar108._0_4_ >> 0x18);
  fVar269 = (float)(auVar218._8_4_ >> 0x18);
  fVar288 = fVar390 * fVar315 + fVar396 * (float)iVar148 + fVar270;
  fVar312 = fVar390 * fVar322 + fVar396 * fVar343 + fVar284;
  fVar313 = fVar390 * fVar323 + fVar396 * (float)auVar149._8_4_ + auVar271._8_4_;
  fVar314 = fVar390 * (float)(auVar274._12_4_ >> 0x18) +
            fVar396 * (float)auVar338._12_4_ + auVar272._12_4_;
  fVar426 = fVar390 * (float)iVar196 + fVar396 * (float)iVar195 + fVar399 * fVar404;
  fVar435 = fVar390 * fVar285 + fVar396 * fVar358 + fVar399 * fVar412;
  fVar438 = fVar390 * (float)auVar201._8_4_ + fVar396 * (float)auVar151._8_4_ + fVar399 * fVar415;
  fVar441 = fVar390 * (float)auVar209._12_4_ +
            fVar396 * (float)auVar159._12_4_ + fVar399 * (float)(auVar161._12_4_ >> 0x18);
  fVar270 = fVar390 * (float)iVar264 + fVar396 * (float)iVar265 + fVar399 * fVar199;
  fVar284 = fVar390 * fVar369 + fVar396 * fVar377 + fVar399 * fVar267;
  fVar198 = fVar390 * (float)auVar202._8_4_ + fVar396 * (float)auVar203._8_4_ + fVar399 * fVar269;
  fVar399 = fVar390 * (float)auVar213._12_4_ +
            fVar396 * (float)auVar217._12_4_ + fVar399 * (float)(auVar219._12_4_ >> 0x18);
  uVar131 = *(ulong *)(prim + uVar127 * 7 + 6);
  uVar200 = *(undefined8 *)(prim + uVar127 * 0xb + 6);
  uVar10 = *(undefined8 *)(prim + uVar127 * 9 + 6);
  uVar11 = *(undefined8 *)(prim + uVar127 * 0xd + 6);
  fVar391 = fVar315 * fVar444 + (float)iVar148 * fVar447 + (float)iVar194 * fVar450;
  fVar397 = fVar322 * fVar444 + fVar343 * fVar447 + fVar384 * fVar450;
  fVar400 = fVar323 * fVar444 + (float)auVar149._8_4_ * fVar447 + (float)auVar150._8_4_ * fVar450;
  fVar402 = (float)(auVar274._12_4_ >> 0x18) * fVar444 +
            (float)auVar338._12_4_ * fVar447 + (float)auVar155._12_4_ * fVar450;
  fVar445 = (float)iVar196 * fVar444 + (float)iVar195 * fVar447 + fVar404 * fVar450;
  fVar448 = fVar285 * fVar444 + fVar358 * fVar447 + fVar412 * fVar450;
  fVar451 = (float)auVar201._8_4_ * fVar444 + (float)auVar151._8_4_ * fVar447 + fVar415 * fVar450;
  fVar453 = (float)auVar209._12_4_ * fVar444 +
            (float)auVar159._12_4_ * fVar447 + (float)(auVar161._12_4_ >> 0x18) * fVar450;
  fVar404 = fVar444 * (float)iVar264 + fVar447 * (float)iVar265 + fVar450 * fVar199;
  fVar412 = fVar444 * fVar369 + fVar447 * fVar377 + fVar450 * fVar267;
  fVar415 = fVar444 * (float)auVar202._8_4_ + fVar447 * (float)auVar203._8_4_ + fVar450 * fVar269;
  fVar444 = fVar444 * (float)auVar213._12_4_ +
            fVar447 * (float)auVar217._12_4_ + fVar450 * (float)(auVar219._12_4_ >> 0x18);
  uVar140 = -(uint)(1e-18 <= ABS(fVar288));
  uVar141 = -(uint)(1e-18 <= ABS(fVar312));
  uVar142 = -(uint)(1e-18 <= ABS(fVar313));
  uVar144 = -(uint)(1e-18 <= ABS(fVar314));
  auVar290._0_4_ = (uint)fVar288 & uVar140;
  auVar290._4_4_ = (uint)fVar312 & uVar141;
  auVar290._8_4_ = (uint)fVar313 & uVar142;
  auVar290._12_4_ = (uint)fVar314 & uVar144;
  auVar324._0_8_ = CONCAT44(~uVar141,~uVar140) & 0x219392ef219392ef;
  auVar324._8_4_ = ~uVar142 & 0x219392ef;
  auVar324._12_4_ = ~uVar144 & 0x219392ef;
  auVar324 = auVar324 | auVar290;
  uVar140 = -(uint)(1e-18 <= ABS(fVar426));
  uVar141 = -(uint)(1e-18 <= ABS(fVar435));
  uVar142 = -(uint)(1e-18 <= ABS(fVar438));
  uVar144 = -(uint)(1e-18 <= ABS(fVar441));
  auVar429._0_4_ = (uint)fVar426 & uVar140;
  auVar429._4_4_ = (uint)fVar435 & uVar141;
  auVar429._8_4_ = (uint)fVar438 & uVar142;
  auVar429._12_4_ = (uint)fVar441 & uVar144;
  auVar291._0_8_ = CONCAT44(~uVar141,~uVar140) & 0x219392ef219392ef;
  auVar291._8_4_ = ~uVar142 & 0x219392ef;
  auVar291._12_4_ = ~uVar144 & 0x219392ef;
  auVar291 = auVar291 | auVar429;
  uVar140 = -(uint)(1e-18 <= ABS(fVar270));
  uVar141 = -(uint)(1e-18 <= ABS(fVar284));
  uVar142 = -(uint)(1e-18 <= ABS(fVar198));
  uVar144 = -(uint)(1e-18 <= ABS(fVar399));
  auVar163._0_4_ = (uint)fVar270 & uVar140;
  auVar163._4_4_ = (uint)fVar284 & uVar141;
  auVar163._8_4_ = (uint)fVar198 & uVar142;
  auVar163._12_4_ = (uint)fVar399 & uVar144;
  auVar349._0_8_ = CONCAT44(~uVar141,~uVar140) & 0x219392ef219392ef;
  auVar349._8_4_ = ~uVar142 & 0x219392ef;
  auVar349._12_4_ = ~uVar144 & 0x219392ef;
  auVar349 = auVar349 | auVar163;
  auVar164 = rcpps(auVar163,auVar324);
  fVar399 = auVar164._0_4_;
  fVar198 = auVar164._4_4_;
  fVar312 = auVar164._8_4_;
  fVar343 = auVar164._12_4_;
  fVar399 = (1.0 - auVar324._0_4_ * fVar399) * fVar399 + fVar399;
  fVar198 = (1.0 - auVar324._4_4_ * fVar198) * fVar198 + fVar198;
  fVar312 = (1.0 - auVar324._8_4_ * fVar312) * fVar312 + fVar312;
  fVar343 = (1.0 - auVar324._12_4_ * fVar343) * fVar343 + fVar343;
  auVar164 = rcpps(auVar164,auVar291);
  fVar270 = auVar164._0_4_;
  auVar292._0_4_ = auVar291._0_4_ * fVar270;
  fVar199 = auVar164._4_4_;
  fVar269 = auVar291._4_4_ * fVar199;
  auVar289._0_8_ = CONCAT44(fVar269,auVar292._0_4_);
  fVar313 = auVar164._8_4_;
  auVar289._8_4_ = auVar291._8_4_ * fVar313;
  fVar358 = auVar164._12_4_;
  fVar270 = (1.0 - auVar292._0_4_) * fVar270 + fVar270;
  fVar199 = (1.0 - fVar269) * fVar199 + fVar199;
  fVar313 = (1.0 - auVar289._8_4_) * fVar313 + fVar313;
  fVar358 = (1.0 - auVar291._12_4_ * fVar358) * fVar358 + fVar358;
  auVar164 = rcpps(auVar164,auVar349);
  fVar284 = auVar164._0_4_;
  auVar350._0_4_ = auVar349._0_4_ * fVar284;
  fVar267 = auVar164._4_4_;
  fVar285 = auVar349._4_4_ * fVar267;
  auVar348._0_8_ = CONCAT44(fVar285,auVar350._0_4_);
  fVar314 = auVar164._8_4_;
  auVar348._8_4_ = auVar349._8_4_ * fVar314;
  fVar369 = auVar164._12_4_;
  uVar12 = *(undefined8 *)(prim + uVar127 * 0x12 + 6);
  fVar284 = (1.0 - auVar350._0_4_) * fVar284 + fVar284;
  fVar267 = (1.0 - fVar285) * fVar267 + fVar267;
  fVar314 = (1.0 - auVar348._8_4_) * fVar314 + fVar314;
  fVar369 = (1.0 - auVar349._12_4_ * fVar369) * fVar369 + fVar369;
  uVar13 = *(ulong *)(prim + uVar127 * 0x16 + 6);
  uVar193 = (undefined2)(uVar131 >> 0x30);
  auVar223._8_4_ = 0;
  auVar223._0_8_ = uVar131;
  auVar223._12_2_ = uVar193;
  auVar223._14_2_ = uVar193;
  uVar193 = (undefined2)(uVar131 >> 0x20);
  auVar222._12_4_ = auVar223._12_4_;
  auVar222._8_2_ = 0;
  auVar222._0_8_ = uVar131;
  auVar222._10_2_ = uVar193;
  auVar221._10_6_ = auVar222._10_6_;
  auVar221._8_2_ = uVar193;
  auVar221._0_8_ = uVar131;
  uVar193 = (undefined2)(uVar131 >> 0x10);
  auVar109._4_8_ = auVar221._8_8_;
  auVar109._2_2_ = uVar193;
  auVar109._0_2_ = uVar193;
  auVar224._0_4_ = (float)(int)(short)uVar131;
  fVar377 = (float)(auVar109._0_4_ >> 0x10);
  auVar204._0_8_ = CONCAT44(fVar377,auVar224._0_4_);
  auVar204._8_4_ = (float)(auVar221._8_4_ >> 0x10);
  auVar295._12_2_ = (short)((uint)fVar269 >> 0x10);
  auVar295._0_12_ = auVar289;
  auVar295._14_2_ = (short)((ulong)uVar200 >> 0x30);
  auVar294._12_4_ = auVar295._12_4_;
  auVar294._0_10_ = auVar289._0_10_;
  auVar294._10_2_ = (short)((ulong)uVar200 >> 0x20);
  auVar293._10_6_ = auVar294._10_6_;
  auVar293._8_2_ = SUB42(fVar269,0);
  auVar293._0_8_ = auVar289._0_8_;
  auVar292._8_8_ = auVar293._8_8_;
  auVar292._6_2_ = (short)((ulong)uVar200 >> 0x10);
  auVar292._4_2_ = (short)((uint)auVar292._0_4_ >> 0x10);
  auVar227._12_2_ = (short)((uint)fVar377 >> 0x10);
  auVar227._0_12_ = auVar204;
  auVar227._14_2_ = (short)((ulong)uVar10 >> 0x30);
  auVar226._12_4_ = auVar227._12_4_;
  auVar226._0_10_ = auVar204._0_10_;
  auVar226._10_2_ = (short)((ulong)uVar10 >> 0x20);
  auVar225._10_6_ = auVar226._10_6_;
  auVar225._8_2_ = SUB42(fVar377,0);
  auVar225._0_8_ = auVar204._0_8_;
  auVar224._8_8_ = auVar225._8_8_;
  auVar224._6_2_ = (short)((ulong)uVar10 >> 0x10);
  auVar224._4_2_ = (short)((uint)auVar224._0_4_ >> 0x10);
  auVar228._0_4_ = (float)(int)(short)uVar10;
  fVar384 = (float)(auVar224._4_4_ >> 0x10);
  auVar205._0_8_ = CONCAT44(fVar384,auVar228._0_4_);
  auVar205._8_4_ = (float)(auVar225._8_4_ >> 0x10);
  auVar353._12_2_ = (short)((uint)fVar285 >> 0x10);
  auVar353._0_12_ = auVar348;
  auVar353._14_2_ = (short)((ulong)uVar11 >> 0x30);
  auVar352._12_4_ = auVar353._12_4_;
  auVar352._0_10_ = auVar348._0_10_;
  auVar352._10_2_ = (short)((ulong)uVar11 >> 0x20);
  auVar351._10_6_ = auVar352._10_6_;
  auVar351._8_2_ = SUB42(fVar285,0);
  auVar351._0_8_ = auVar348._0_8_;
  auVar350._8_8_ = auVar351._8_8_;
  auVar350._6_2_ = (short)((ulong)uVar11 >> 0x10);
  auVar350._4_2_ = (short)((uint)auVar350._0_4_ >> 0x10);
  auVar231._12_2_ = (short)((uint)fVar384 >> 0x10);
  auVar231._0_12_ = auVar205;
  auVar231._14_2_ = (short)((ulong)uVar12 >> 0x30);
  auVar230._12_4_ = auVar231._12_4_;
  auVar230._0_10_ = auVar205._0_10_;
  auVar230._10_2_ = (short)((ulong)uVar12 >> 0x20);
  auVar229._10_6_ = auVar230._10_6_;
  auVar229._8_2_ = SUB42(fVar384,0);
  auVar229._0_8_ = auVar205._0_8_;
  auVar228._8_8_ = auVar229._8_8_;
  auVar228._6_2_ = (short)((ulong)uVar12 >> 0x10);
  auVar228._4_2_ = (short)((uint)auVar228._0_4_ >> 0x10);
  fVar390 = (float)(auVar228._4_4_ >> 0x10);
  fVar396 = (float)(auVar229._8_4_ >> 0x10);
  uVar193 = (undefined2)(uVar13 >> 0x30);
  auVar167._8_4_ = 0;
  auVar167._0_8_ = uVar13;
  auVar167._12_2_ = uVar193;
  auVar167._14_2_ = uVar193;
  uVar193 = (undefined2)(uVar13 >> 0x20);
  auVar166._12_4_ = auVar167._12_4_;
  auVar166._8_2_ = 0;
  auVar166._0_8_ = uVar13;
  auVar166._10_2_ = uVar193;
  auVar165._10_6_ = auVar166._10_6_;
  auVar165._8_2_ = uVar193;
  auVar165._0_8_ = uVar13;
  uVar193 = (undefined2)(uVar13 >> 0x10);
  auVar110._4_8_ = auVar165._8_8_;
  auVar110._2_2_ = uVar193;
  auVar110._0_2_ = uVar193;
  uVar131 = *(ulong *)(prim + uVar127 * 0x14 + 6);
  uVar193 = (undefined2)(uVar131 >> 0x30);
  auVar170._8_4_ = 0;
  auVar170._0_8_ = uVar131;
  auVar170._12_2_ = uVar193;
  auVar170._14_2_ = uVar193;
  uVar193 = (undefined2)(uVar131 >> 0x20);
  auVar169._12_4_ = auVar170._12_4_;
  auVar169._8_2_ = 0;
  auVar169._0_8_ = uVar131;
  auVar169._10_2_ = uVar193;
  auVar168._10_6_ = auVar169._10_6_;
  auVar168._8_2_ = uVar193;
  auVar168._0_8_ = uVar131;
  uVar193 = (undefined2)(uVar131 >> 0x10);
  auVar111._4_8_ = auVar168._8_8_;
  auVar111._2_2_ = uVar193;
  auVar111._0_2_ = uVar193;
  fVar269 = (float)(auVar111._0_4_ >> 0x10);
  fVar315 = (float)(auVar168._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar127 * 0x18 + 6);
  uVar193 = (undefined2)(uVar14 >> 0x30);
  auVar234._8_4_ = 0;
  auVar234._0_8_ = uVar14;
  auVar234._12_2_ = uVar193;
  auVar234._14_2_ = uVar193;
  uVar193 = (undefined2)(uVar14 >> 0x20);
  auVar233._12_4_ = auVar234._12_4_;
  auVar233._8_2_ = 0;
  auVar233._0_8_ = uVar14;
  auVar233._10_2_ = uVar193;
  auVar232._10_6_ = auVar233._10_6_;
  auVar232._8_2_ = uVar193;
  auVar232._0_8_ = uVar14;
  uVar193 = (undefined2)(uVar14 >> 0x10);
  auVar112._4_8_ = auVar232._8_8_;
  auVar112._2_2_ = uVar193;
  auVar112._0_2_ = uVar193;
  uVar15 = *(ulong *)(prim + uVar127 * 0x1d + 6);
  uVar193 = (undefined2)(uVar15 >> 0x30);
  auVar173._8_4_ = 0;
  auVar173._0_8_ = uVar15;
  auVar173._12_2_ = uVar193;
  auVar173._14_2_ = uVar193;
  uVar193 = (undefined2)(uVar15 >> 0x20);
  auVar172._12_4_ = auVar173._12_4_;
  auVar172._8_2_ = 0;
  auVar172._0_8_ = uVar15;
  auVar172._10_2_ = uVar193;
  auVar171._10_6_ = auVar172._10_6_;
  auVar171._8_2_ = uVar193;
  auVar171._0_8_ = uVar15;
  uVar193 = (undefined2)(uVar15 >> 0x10);
  auVar113._4_8_ = auVar171._8_8_;
  auVar113._2_2_ = uVar193;
  auVar113._0_2_ = uVar193;
  fVar285 = (float)(auVar113._0_4_ >> 0x10);
  fVar322 = (float)(auVar171._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar127 * 0x21 + 6);
  uVar193 = (undefined2)(uVar16 >> 0x30);
  auVar237._8_4_ = 0;
  auVar237._0_8_ = uVar16;
  auVar237._12_2_ = uVar193;
  auVar237._14_2_ = uVar193;
  uVar193 = (undefined2)(uVar16 >> 0x20);
  auVar236._12_4_ = auVar237._12_4_;
  auVar236._8_2_ = 0;
  auVar236._0_8_ = uVar16;
  auVar236._10_2_ = uVar193;
  auVar235._10_6_ = auVar236._10_6_;
  auVar235._8_2_ = uVar193;
  auVar235._0_8_ = uVar16;
  uVar193 = (undefined2)(uVar16 >> 0x10);
  auVar114._4_8_ = auVar235._8_8_;
  auVar114._2_2_ = uVar193;
  auVar114._0_2_ = uVar193;
  uVar17 = *(ulong *)(prim + uVar127 * 0x1f + 6);
  uVar193 = (undefined2)(uVar17 >> 0x30);
  auVar176._8_4_ = 0;
  auVar176._0_8_ = uVar17;
  auVar176._12_2_ = uVar193;
  auVar176._14_2_ = uVar193;
  uVar193 = (undefined2)(uVar17 >> 0x20);
  auVar175._12_4_ = auVar176._12_4_;
  auVar175._8_2_ = 0;
  auVar175._0_8_ = uVar17;
  auVar175._10_2_ = uVar193;
  auVar174._10_6_ = auVar175._10_6_;
  auVar174._8_2_ = uVar193;
  auVar174._0_8_ = uVar17;
  uVar193 = (undefined2)(uVar17 >> 0x10);
  auVar115._4_8_ = auVar174._8_8_;
  auVar115._2_2_ = uVar193;
  auVar115._0_2_ = uVar193;
  fVar288 = (float)(auVar115._0_4_ >> 0x10);
  fVar323 = (float)(auVar174._8_4_ >> 0x10);
  uVar127 = *(ulong *)(prim + uVar127 * 0x23 + 6);
  uVar193 = (undefined2)(uVar127 >> 0x30);
  auVar240._8_4_ = 0;
  auVar240._0_8_ = uVar127;
  auVar240._12_2_ = uVar193;
  auVar240._14_2_ = uVar193;
  uVar193 = (undefined2)(uVar127 >> 0x20);
  auVar239._12_4_ = auVar240._12_4_;
  auVar239._8_2_ = 0;
  auVar239._0_8_ = uVar127;
  auVar239._10_2_ = uVar193;
  auVar238._10_6_ = auVar239._10_6_;
  auVar238._8_2_ = uVar193;
  auVar238._0_8_ = uVar127;
  uVar193 = (undefined2)(uVar127 >> 0x10);
  auVar116._4_8_ = auVar238._8_8_;
  auVar116._2_2_ = uVar193;
  auVar116._0_2_ = uVar193;
  auVar296._0_8_ =
       CONCAT44(((((float)(auVar292._4_4_ >> 0x10) - fVar377) * fVar147 + fVar377) - fVar397) *
                fVar198,((((float)(int)(short)uVar200 - auVar224._0_4_) * fVar147 + auVar224._0_4_)
                        - fVar391) * fVar399);
  auVar296._8_4_ =
       ((((float)(auVar293._8_4_ >> 0x10) - auVar204._8_4_) * fVar147 + auVar204._8_4_) - fVar400) *
       fVar312;
  auVar296._12_4_ =
       ((((float)(auVar294._12_4_ >> 0x10) - (float)(auVar222._12_4_ >> 0x10)) * fVar147 +
        (float)(auVar222._12_4_ >> 0x10)) - fVar402) * fVar343;
  auVar354._0_4_ =
       ((((float)(int)(short)uVar11 - auVar228._0_4_) * fVar147 + auVar228._0_4_) - fVar391) *
       fVar399;
  auVar354._4_4_ =
       ((((float)(auVar350._4_4_ >> 0x10) - fVar384) * fVar147 + fVar384) - fVar397) * fVar198;
  auVar354._8_4_ =
       ((((float)(auVar351._8_4_ >> 0x10) - auVar205._8_4_) * fVar147 + auVar205._8_4_) - fVar400) *
       fVar312;
  auVar354._12_4_ =
       ((((float)(auVar352._12_4_ >> 0x10) - (float)(auVar226._12_4_ >> 0x10)) * fVar147 +
        (float)(auVar226._12_4_ >> 0x10)) - fVar402) * fVar343;
  auVar371._0_8_ =
       CONCAT44(((((float)(auVar110._0_4_ >> 0x10) - fVar390) * fVar147 + fVar390) - fVar448) *
                fVar199,((((float)(int)(short)uVar13 - (float)(int)(short)uVar12) * fVar147 +
                         (float)(int)(short)uVar12) - fVar445) * fVar270);
  auVar371._8_4_ =
       ((((float)(auVar165._8_4_ >> 0x10) - fVar396) * fVar147 + fVar396) - fVar451) * fVar313;
  auVar371._12_4_ =
       ((((float)(auVar166._12_4_ >> 0x10) - (float)(auVar230._12_4_ >> 0x10)) * fVar147 +
        (float)(auVar230._12_4_ >> 0x10)) - fVar453) * fVar358;
  auVar382._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar131) * fVar147 +
        (float)(int)(short)uVar131) - fVar445) * fVar270;
  auVar382._4_4_ =
       ((((float)(auVar112._0_4_ >> 0x10) - fVar269) * fVar147 + fVar269) - fVar448) * fVar199;
  auVar382._8_4_ =
       ((((float)(auVar232._8_4_ >> 0x10) - fVar315) * fVar147 + fVar315) - fVar451) * fVar313;
  auVar382._12_4_ =
       ((((float)(auVar233._12_4_ >> 0x10) - (float)(auVar169._12_4_ >> 0x10)) * fVar147 +
        (float)(auVar169._12_4_ >> 0x10)) - fVar453) * fVar358;
  auVar394._0_8_ =
       CONCAT44(((((float)(auVar114._0_4_ >> 0x10) - fVar285) * fVar147 + fVar285) - fVar412) *
                fVar267,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar147 +
                         (float)(int)(short)uVar15) - fVar404) * fVar284);
  auVar394._8_4_ =
       ((((float)(auVar235._8_4_ >> 0x10) - fVar322) * fVar147 + fVar322) - fVar415) * fVar314;
  auVar394._12_4_ =
       ((((float)(auVar236._12_4_ >> 0x10) - (float)(auVar172._12_4_ >> 0x10)) * fVar147 +
        (float)(auVar172._12_4_ >> 0x10)) - fVar444) * fVar369;
  auVar407._0_4_ =
       ((((float)(int)(short)uVar127 - (float)(int)(short)uVar17) * fVar147 +
        (float)(int)(short)uVar17) - fVar404) * fVar284;
  auVar407._4_4_ =
       ((((float)(auVar116._0_4_ >> 0x10) - fVar288) * fVar147 + fVar288) - fVar412) * fVar267;
  auVar407._8_4_ =
       ((((float)(auVar238._8_4_ >> 0x10) - fVar323) * fVar147 + fVar323) - fVar415) * fVar314;
  auVar407._12_4_ =
       ((((float)(auVar239._12_4_ >> 0x10) - (float)(auVar175._12_4_ >> 0x10)) * fVar147 +
        (float)(auVar175._12_4_ >> 0x10)) - fVar444) * fVar369;
  auVar276._8_4_ = auVar296._8_4_;
  auVar276._0_8_ = auVar296._0_8_;
  auVar276._12_4_ = auVar296._12_4_;
  auVar277 = minps(auVar276,auVar354);
  auVar177._8_4_ = auVar371._8_4_;
  auVar177._0_8_ = auVar371._0_8_;
  auVar177._12_4_ = auVar371._12_4_;
  auVar164 = minps(auVar177,auVar382);
  auVar277 = maxps(auVar277,auVar164);
  auVar178._8_4_ = auVar394._8_4_;
  auVar178._0_8_ = auVar394._0_8_;
  auVar178._12_4_ = auVar394._12_4_;
  auVar164 = minps(auVar178,auVar407);
  uVar132 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar241._4_4_ = uVar132;
  auVar241._0_4_ = uVar132;
  auVar241._8_4_ = uVar132;
  auVar241._12_4_ = uVar132;
  auVar164 = maxps(auVar164,auVar241);
  auVar164 = maxps(auVar277,auVar164);
  fVar147 = auVar164._0_4_ * 0.99999964;
  fVar270 = auVar164._4_4_ * 0.99999964;
  fVar284 = auVar164._8_4_ * 0.99999964;
  fVar198 = auVar164._12_4_ * 0.99999964;
  auVar164 = maxps(auVar296,auVar354);
  auVar277 = maxps(auVar371,auVar382);
  auVar164 = minps(auVar164,auVar277);
  auVar277 = maxps(auVar394,auVar407);
  fVar399 = (ray->super_RayK<1>).tfar;
  auVar179._4_4_ = fVar399;
  auVar179._0_4_ = fVar399;
  auVar179._8_4_ = fVar399;
  auVar179._12_4_ = fVar399;
  auVar277 = minps(auVar277,auVar179);
  auVar164 = minps(auVar164,auVar277);
  auVar242._0_4_ = -(uint)(PVar19 != (Primitive)0x0 && fVar147 <= auVar164._0_4_ * 1.0000004);
  auVar242._4_4_ = -(uint)(1 < (byte)PVar19 && fVar270 <= auVar164._4_4_ * 1.0000004);
  auVar242._8_4_ = -(uint)(2 < (byte)PVar19 && fVar284 <= auVar164._8_4_ * 1.0000004);
  auVar242._12_4_ = -(uint)(3 < (byte)PVar19 && fVar198 <= auVar164._12_4_ * 1.0000004);
  uVar132 = movmskps((int)prim,auVar242);
  local_2e0 = CONCAT44((int)((ulong)prim >> 0x20),uVar132);
  auVar243._0_12_ = mm_lookupmask_ps._240_12_;
  auVar243._12_4_ = 0;
  local_2e8 = prim;
LAB_003961c9:
  if (local_2e0 == 0) {
    return;
  }
  lVar138 = 0;
  if (local_2e0 != 0) {
    for (; (local_2e0 >> lVar138 & 1) == 0; lVar138 = lVar138 + 1) {
    }
  }
  uVar140 = *(uint *)(local_2e8 + 2);
  uVar141 = *(uint *)(local_2e8 + lVar138 * 4 + 6);
  pGVar26 = (context->scene->geometries).items[uVar140].ptr;
  uVar131 = (ulong)*(uint *)(*(long *)&pGVar26->field_0x58 +
                            (ulong)uVar141 *
                            pGVar26[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar399 = pGVar26->fnumTimeSegments;
  fVar199 = (pGVar26->time_range).lower;
  fVar267 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar199) /
            ((pGVar26->time_range).upper - fVar199)) * fVar399;
  fVar199 = floorf(fVar267);
  fVar399 = fVar399 + -1.0;
  if (fVar399 <= fVar199) {
    fVar199 = fVar399;
  }
  fVar399 = 0.0;
  if (0.0 <= fVar199) {
    fVar399 = fVar199;
  }
  _Var27 = pGVar26[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar128 = (long)(int)fVar399 * 0x38;
  lVar28 = *(long *)(_Var27 + 0x10 + lVar128);
  lVar138 = uVar131 + 1;
  p_Var29 = pGVar26[4].occlusionFilterN;
  lVar30 = *(long *)(_Var27 + 0x38 + lVar128);
  lVar31 = *(long *)(_Var27 + 0x48 + lVar128);
  pfVar1 = (float *)(lVar30 + lVar31 * uVar131);
  pfVar2 = (float *)(lVar30 + lVar31 * lVar138);
  pfVar3 = (float *)(*(long *)(p_Var29 + lVar128 + 0x38) +
                    uVar131 * *(long *)(p_Var29 + lVar128 + 0x48));
  fVar267 = fVar267 - fVar399;
  fVar313 = 1.0 - fVar267;
  pfVar4 = (float *)(*(long *)(p_Var29 + lVar128 + 0x38) +
                    *(long *)(p_Var29 + lVar128 + 0x48) * lVar138);
  pRVar135 = *(RTCIntersectArguments **)(_Var27 + lVar128);
  pRVar5 = (RTCRayQueryFlags *)((long)&pRVar135->flags + lVar28 * uVar131);
  pRVar6 = (RTCRayQueryFlags *)((long)&pRVar135->flags + lVar28 * lVar138);
  pRVar133 = (RTCIntersectArguments *)(*(long *)(p_Var29 + lVar128 + 0x10) * lVar138);
  pfVar7 = (float *)(*(long *)(p_Var29 + lVar128) + *(long *)(p_Var29 + lVar128 + 0x10) * uVar131);
  local_5c8._0_4_ = (float)*pRVar5 * fVar313 + *pfVar1 * fVar267;
  local_5c8._4_4_ = (float)pRVar5[1] * fVar313 + pfVar1[1] * fVar267;
  fStack_5c0 = (float)pRVar5[2] * fVar313 + pfVar1[2] * fVar267;
  fVar315 = (float)pRVar5[3] * fVar313 + pfVar1[3] * fVar267;
  pfVar1 = (float *)((long)&pRVar133->flags + *(long *)(p_Var29 + lVar128));
  local_548._0_4_ = (float)*pRVar6 * fVar313 + *pfVar2 * fVar267;
  local_548._4_4_ = (float)pRVar6[1] * fVar313 + pfVar2[1] * fVar267;
  fStack_540 = (float)pRVar6[2] * fVar313 + pfVar2[2] * fVar267;
  fStack_53c = (float)pRVar6[3] * fVar313 + pfVar2[3] * fVar267;
  fVar384 = (*pfVar7 * fVar313 + *pfVar3 * fVar267) * 0.33333334 + (float)local_5c8._0_4_;
  fVar390 = (pfVar7[1] * fVar313 + pfVar3[1] * fVar267) * 0.33333334 + (float)local_5c8._4_4_;
  fVar396 = (pfVar7[2] * fVar313 + pfVar3[2] * fVar267) * 0.33333334 + fStack_5c0;
  fVar322 = (float)local_548._0_4_ - (fVar313 * *pfVar1 + fVar267 * *pfVar4) * 0.33333334;
  fVar323 = (float)local_548._4_4_ - (fVar313 * pfVar1[1] + fVar267 * pfVar4[1]) * 0.33333334;
  fVar343 = fStack_540 - (fVar313 * pfVar1[2] + fVar267 * pfVar4[2]) * 0.33333334;
  fVar399 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar199 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar269 = (ray->super_RayK<1>).org.field_0.m128[2];
  local_308 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar285 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar288 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar312 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fVar358 = local_308 * local_308;
  fVar369 = fVar285 * fVar285;
  fVar377 = fVar288 * fVar288;
  fVar312 = fVar312 * fVar312;
  fVar314 = fVar358 + fVar369 + fVar377;
  auVar316._0_8_ = CONCAT44(fVar369 + fVar369 + fVar312,fVar314);
  auVar316._8_4_ = fVar377 + fVar369 + fVar377;
  auVar316._12_4_ = fVar312 + fVar369 + fVar312;
  auVar297._8_4_ = auVar316._8_4_;
  auVar297._0_8_ = auVar316._0_8_;
  auVar297._12_4_ = auVar316._12_4_;
  auVar164 = rcpss(auVar297,auVar316);
  local_4b8 = (2.0 - fVar314 * auVar164._0_4_) * auVar164._0_4_ *
              (((fStack_5c0 + fVar396 + fVar343 + fStack_540) * 0.25 - fVar269) * fVar288 +
              (((float)local_5c8._4_4_ + fVar390 + fVar323 + (float)local_548._4_4_) * 0.25 -
              fVar199) * fVar285 +
              (((float)local_5c8._0_4_ + fVar384 + fVar322 + (float)local_548._0_4_) * 0.25 -
              fVar399) * local_308);
  local_2f8 = ZEXT416((uint)local_4b8);
  fVar399 = local_308 * local_4b8 + fVar399;
  fVar199 = fVar285 * local_4b8 + fVar199;
  fVar269 = fVar288 * local_4b8 + fVar269;
  local_5c8._0_4_ = (float)local_5c8._0_4_ - fVar399;
  local_5c8._4_4_ = (float)local_5c8._4_4_ - fVar199;
  fStack_5c0 = fStack_5c0 - fVar269;
  fStack_5bc = fVar315 - 0.0;
  fVar322 = fVar322 - fVar399;
  fVar323 = fVar323 - fVar199;
  fVar343 = fVar343 - fVar269;
  fVar312 = (fStack_53c - (fVar313 * pfVar1[3] + fVar267 * pfVar4[3]) * 0.33333334) - 0.0;
  fVar384 = fVar384 - fVar399;
  fVar390 = fVar390 - fVar199;
  fVar396 = fVar396 - fVar269;
  fVar314 = ((pfVar7[3] * fVar313 + pfVar3[3] * fVar267) * 0.33333334 + fVar315) - 0.0;
  local_548._0_4_ = (float)local_548._0_4_ - fVar399;
  local_548._4_4_ = (float)local_548._4_4_ - fVar199;
  fStack_540 = fStack_540 - fVar269;
  fStack_53c = fStack_53c - 0.0;
  fVar267 = fVar358 + fVar377 + fVar369;
  fVar269 = fVar358 + fVar377 + fVar369;
  fVar313 = fVar358 + fVar377 + fVar369;
  fVar358 = fVar358 + fVar377 + fVar369;
  local_2c8 = fVar312;
  fStack_2c4 = fVar312;
  fStack_2c0 = fVar312;
  fStack_2bc = fVar312;
  fStack_304 = local_308;
  fStack_300 = local_308;
  fStack_2fc = local_308;
  local_2d8 = ABS(fVar267);
  fStack_2d4 = ABS(fVar269);
  fStack_2d0 = ABS(fVar313);
  fStack_2cc = ABS(fVar358);
  pSVar129 = (StackEntry *)0x1;
  local_5ec = 1.4013e-45;
  fVar399 = 0.0;
  fVar199 = 1.0;
  pRVar136 = (RTCIntersectArguments *)0x0;
  fStack_4b4 = local_4b8;
  fStack_4b0 = local_4b8;
  fStack_4ac = local_4b8;
  do {
    fVar415 = fVar199 - fVar399;
    fVar369 = fVar415 * 0.0 + fVar399;
    fVar377 = fVar415 * 0.33333334 + fVar399;
    fVar404 = fVar415 * 0.6666667 + fVar399;
    fVar412 = fVar415 * 1.0 + fVar399;
    fVar392 = 1.0 - fVar369;
    fVar398 = 1.0 - fVar377;
    fVar401 = 1.0 - fVar404;
    fVar403 = 1.0 - fVar412;
    fVar315 = fVar384 * fVar392 + fVar322 * fVar369;
    fVar391 = fVar384 * fVar398 + fVar322 * fVar377;
    fVar397 = fVar384 * fVar401 + fVar322 * fVar404;
    fVar400 = fVar384 * fVar403 + fVar322 * fVar412;
    fVar381 = fVar390 * fVar392 + fVar323 * fVar369;
    fVar385 = fVar390 * fVar398 + fVar323 * fVar377;
    fVar386 = fVar390 * fVar401 + fVar323 * fVar404;
    fVar388 = fVar390 * fVar403 + fVar323 * fVar412;
    fVar370 = fVar396 * fVar392 + fVar343 * fVar369;
    fVar378 = fVar396 * fVar398 + fVar343 * fVar377;
    fVar379 = fVar396 * fVar401 + fVar343 * fVar404;
    fVar380 = fVar396 * fVar403 + fVar343 * fVar412;
    fVar347 = fVar314 * fVar392 + local_2c8 * fVar369;
    fVar359 = fVar314 * fVar398 + fStack_2c4 * fVar377;
    fVar360 = fVar314 * fVar401 + fStack_2c0 * fVar404;
    fVar361 = fVar314 * fVar403 + fStack_2bc * fVar412;
    fVar402 = ((float)local_5c8._0_4_ * fVar392 + fVar384 * fVar369) * fVar392 + fVar369 * fVar315;
    fVar426 = ((float)local_5c8._0_4_ * fVar398 + fVar384 * fVar377) * fVar398 + fVar377 * fVar391;
    fVar435 = ((float)local_5c8._0_4_ * fVar401 + fVar384 * fVar404) * fVar401 + fVar404 * fVar397;
    fVar438 = ((float)local_5c8._0_4_ * fVar403 + fVar384 * fVar412) * fVar403 + fVar412 * fVar400;
    fVar441 = ((float)local_5c8._4_4_ * fVar392 + fVar390 * fVar369) * fVar392 + fVar369 * fVar381;
    fVar445 = ((float)local_5c8._4_4_ * fVar398 + fVar390 * fVar377) * fVar398 + fVar377 * fVar385;
    fVar447 = ((float)local_5c8._4_4_ * fVar401 + fVar390 * fVar404) * fVar401 + fVar404 * fVar386;
    fVar448 = ((float)local_5c8._4_4_ * fVar403 + fVar390 * fVar412) * fVar403 + fVar412 * fVar388;
    fVar450 = (fStack_5c0 * fVar392 + fVar396 * fVar369) * fVar392 + fVar369 * fVar370;
    fVar451 = (fStack_5c0 * fVar398 + fVar396 * fVar377) * fVar398 + fVar377 * fVar378;
    fVar453 = (fStack_5c0 * fVar401 + fVar396 * fVar404) * fVar401 + fVar404 * fVar379;
    fVar335 = (fStack_5c0 * fVar403 + fVar396 * fVar412) * fVar403 + fVar412 * fVar380;
    fVar336 = (fStack_5bc * fVar392 + fVar314 * fVar369) * fVar392 + fVar369 * fVar347;
    fVar344 = (fStack_5bc * fVar398 + fVar314 * fVar377) * fVar398 + fVar377 * fVar359;
    fVar345 = (fStack_5bc * fVar401 + fVar314 * fVar404) * fVar401 + fVar404 * fVar360;
    fVar346 = (fStack_5bc * fVar403 + fVar314 * fVar412) * fVar403 + fVar412 * fVar361;
    fVar444 = fVar315 * fVar392 + (fVar322 * fVar392 + (float)local_548._0_4_ * fVar369) * fVar369;
    fVar391 = fVar391 * fVar398 + (fVar322 * fVar398 + (float)local_548._0_4_ * fVar377) * fVar377;
    fVar397 = fVar397 * fVar401 + (fVar322 * fVar401 + (float)local_548._0_4_ * fVar404) * fVar404;
    fVar400 = fVar400 * fVar403 + (fVar322 * fVar403 + (float)local_548._0_4_ * fVar412) * fVar412;
    fVar381 = fVar381 * fVar392 + (fVar323 * fVar392 + (float)local_548._4_4_ * fVar369) * fVar369;
    fVar385 = fVar385 * fVar398 + (fVar323 * fVar398 + (float)local_548._4_4_ * fVar377) * fVar377;
    fVar387 = fVar386 * fVar401 + (fVar323 * fVar401 + (float)local_548._4_4_ * fVar404) * fVar404;
    fVar389 = fVar388 * fVar403 + (fVar323 * fVar403 + (float)local_548._4_4_ * fVar412) * fVar412;
    fVar370 = fVar370 * fVar392 + (fVar343 * fVar392 + fStack_540 * fVar369) * fVar369;
    fVar378 = fVar378 * fVar398 + (fVar343 * fVar398 + fStack_540 * fVar377) * fVar377;
    fVar379 = fVar379 * fVar401 + (fVar343 * fVar401 + fStack_540 * fVar404) * fVar404;
    fVar386 = fVar380 * fVar403 + (fVar343 * fVar403 + fStack_540 * fVar412) * fVar412;
    fVar347 = fVar347 * fVar392 + (local_2c8 * fVar392 + fStack_53c * fVar369) * fVar369;
    fVar359 = fVar359 * fVar398 + (fStack_2c4 * fVar398 + fStack_53c * fVar377) * fVar377;
    fVar360 = fVar360 * fVar401 + (fStack_2c0 * fVar401 + fStack_53c * fVar404) * fVar404;
    fVar361 = fVar361 * fVar403 + (fStack_2bc * fVar403 + fStack_53c * fVar412) * fVar412;
    local_498 = fVar392 * fVar402 + fVar369 * fVar444;
    fStack_494 = fVar398 * fVar426 + fVar377 * fVar391;
    fStack_490 = fVar401 * fVar435 + fVar404 * fVar397;
    fStack_48c = fVar403 * fVar438 + fVar412 * fVar400;
    fVar427 = fVar392 * fVar441 + fVar369 * fVar381;
    fVar436 = fVar398 * fVar445 + fVar377 * fVar385;
    fVar439 = fVar401 * fVar447 + fVar404 * fVar387;
    fVar442 = fVar403 * fVar448 + fVar412 * fVar389;
    fVar405 = fVar392 * fVar450 + fVar369 * fVar370;
    fVar413 = fVar398 * fVar451 + fVar377 * fVar378;
    fVar416 = fVar401 * fVar453 + fVar404 * fVar379;
    fVar418 = fVar403 * fVar335 + fVar412 * fVar386;
    fVar315 = fVar415 * 0.11111111;
    fVar393 = fVar392 * fVar336 + fVar369 * fVar347;
    fVar398 = fVar398 * fVar344 + fVar377 * fVar359;
    uVar200 = CONCAT44(fVar398,fVar393);
    fVar401 = fVar401 * fVar345 + fVar404 * fVar360;
    fVar403 = fVar403 * fVar346 + fVar412 * fVar361;
    fVar412 = (fVar444 - fVar402) * 3.0 * fVar315;
    fVar444 = (fVar391 - fVar426) * 3.0 * fVar315;
    fVar391 = (fVar397 - fVar435) * 3.0 * fVar315;
    fVar397 = (fVar400 - fVar438) * 3.0 * fVar315;
    fVar388 = (fVar381 - fVar441) * 3.0 * fVar315;
    fVar392 = (fVar385 - fVar445) * 3.0 * fVar315;
    fVar387 = (fVar387 - fVar447) * 3.0 * fVar315;
    fVar389 = (fVar389 - fVar448) * 3.0 * fVar315;
    fVar380 = (fVar370 - fVar450) * 3.0 * fVar315;
    fVar381 = (fVar378 - fVar451) * 3.0 * fVar315;
    fVar385 = (fVar379 - fVar453) * 3.0 * fVar315;
    fVar386 = (fVar386 - fVar335) * 3.0 * fVar315;
    fVar369 = fVar315 * (fVar359 - fVar344) * 3.0;
    fVar377 = fVar315 * (fVar360 - fVar345) * 3.0;
    fVar404 = fVar315 * (fVar361 - fVar346) * 3.0;
    auVar244._4_4_ = fVar401;
    auVar244._0_4_ = fVar398;
    auVar244._8_4_ = fVar403;
    auVar244._12_4_ = 0;
    local_5d8._4_4_ = fVar398 + fVar369;
    local_5d8._0_4_ = fVar393 + fVar315 * (fVar347 - fVar336) * 3.0;
    fStack_5d0 = fVar401 + fVar377;
    fStack_5cc = fVar403 + fVar404;
    auVar245._0_8_ = CONCAT44(fVar401 - fVar377,fVar398 - fVar369);
    auVar245._8_4_ = fVar403 - fVar404;
    auVar245._12_4_ = 0;
    fVar400 = fVar436 - fVar427;
    fVar402 = fVar439 - fVar436;
    fVar426 = fVar442 - fVar439;
    fVar435 = 0.0 - fVar442;
    fVar438 = fVar413 - fVar405;
    fVar445 = fVar416 - fVar413;
    fVar448 = fVar418 - fVar416;
    fVar451 = 0.0 - fVar418;
    fVar441 = fVar388 * fVar438 - fVar380 * fVar400;
    fVar447 = fVar392 * fVar445 - fVar381 * fVar402;
    fVar450 = fVar387 * fVar448 - fVar385 * fVar426;
    fVar453 = fVar389 * fVar451 - fVar386 * fVar435;
    fVar446 = fStack_494 - local_498;
    fVar449 = fStack_490 - fStack_494;
    fVar452 = fStack_48c - fStack_490;
    fVar454 = 0.0 - fStack_48c;
    fVar335 = fVar380 * fVar446 - fVar412 * fVar438;
    fVar336 = fVar381 * fVar449 - fVar444 * fVar445;
    fVar344 = fVar385 * fVar452 - fVar391 * fVar448;
    fVar345 = fVar386 * fVar454 - fVar397 * fVar451;
    fVar346 = fVar412 * fVar400 - fVar388 * fVar446;
    fVar347 = fVar444 * fVar402 - fVar392 * fVar449;
    fVar359 = fVar391 * fVar426 - fVar387 * fVar452;
    fVar360 = fVar397 * fVar435 - fVar389 * fVar454;
    auVar180._0_4_ = fVar438 * fVar438;
    auVar180._4_4_ = fVar445 * fVar445;
    auVar180._8_4_ = fVar448 * fVar448;
    auVar180._12_4_ = fVar451 * fVar451;
    auVar355._0_4_ = fVar446 * fVar446 + fVar400 * fVar400 + auVar180._0_4_;
    auVar355._4_4_ = fVar449 * fVar449 + fVar402 * fVar402 + auVar180._4_4_;
    auVar355._8_4_ = fVar452 * fVar452 + fVar426 * fVar426 + auVar180._8_4_;
    auVar355._12_4_ = fVar454 * fVar454 + fVar435 * fVar435 + auVar180._12_4_;
    auVar164 = rcpps(auVar180,auVar355);
    fVar315 = auVar164._0_4_;
    fVar369 = auVar164._4_4_;
    fVar377 = auVar164._8_4_;
    fVar404 = auVar164._12_4_;
    fVar315 = (1.0 - fVar315 * auVar355._0_4_) * fVar315 + fVar315;
    fVar369 = (1.0 - fVar369 * auVar355._4_4_) * fVar369 + fVar369;
    fVar377 = (1.0 - fVar377 * auVar355._8_4_) * fVar377 + fVar377;
    fVar404 = (1.0 - fVar404 * auVar355._12_4_) * fVar404 + fVar404;
    fVar361 = fVar438 * fVar392 - fVar400 * fVar381;
    fVar370 = fVar445 * fVar387 - fVar402 * fVar385;
    fVar378 = fVar448 * fVar389 - fVar426 * fVar386;
    fVar379 = fVar451 * 0.0 - fVar435 * 0.0;
    auVar278._8_4_ = fVar401;
    auVar278._0_8_ = uVar200;
    auVar278._12_4_ = fVar403;
    fVar393 = fVar446 * fVar381 - fVar438 * fVar444;
    fVar398 = fVar449 * fVar385 - fVar445 * fVar391;
    fVar424 = fVar452 * fVar386 - fVar448 * fVar397;
    fVar425 = fVar454 * 0.0 - fVar451 * 0.0;
    fVar428 = fVar400 * fVar444 - fVar446 * fVar392;
    fVar437 = fVar402 * fVar391 - fVar449 * fVar387;
    fVar440 = fVar426 * fVar397 - fVar452 * fVar389;
    fVar443 = fVar435 * 0.0 - fVar454 * 0.0;
    auVar420._0_4_ = fVar393 * fVar393 + fVar428 * fVar428;
    auVar420._4_4_ = fVar398 * fVar398 + fVar437 * fVar437;
    auVar420._8_4_ = fVar424 * fVar424 + fVar440 * fVar440;
    auVar420._12_4_ = fVar425 * fVar425 + fVar443 * fVar443;
    auVar325._0_4_ = (fVar441 * fVar441 + fVar335 * fVar335 + fVar346 * fVar346) * fVar315;
    auVar325._4_4_ = (fVar447 * fVar447 + fVar336 * fVar336 + fVar347 * fVar347) * fVar369;
    auVar325._8_4_ = (fVar450 * fVar450 + fVar344 * fVar344 + fVar359 * fVar359) * fVar377;
    auVar325._12_4_ = (fVar453 * fVar453 + fVar345 * fVar345 + fVar360 * fVar360) * fVar404;
    auVar362._0_4_ = (fVar361 * fVar361 + auVar420._0_4_) * fVar315;
    auVar362._4_4_ = (fVar370 * fVar370 + auVar420._4_4_) * fVar369;
    auVar362._8_4_ = (fVar378 * fVar378 + auVar420._8_4_) * fVar377;
    auVar362._12_4_ = (fVar379 * fVar379 + auVar420._12_4_) * fVar404;
    auVar326 = maxps(auVar325,auVar362);
    auVar337._8_4_ = fVar401;
    auVar337._0_8_ = uVar200;
    auVar337._12_4_ = fVar403;
    auVar164 = maxps(auVar337,_local_5d8);
    auVar363._8_4_ = auVar245._8_4_;
    auVar363._0_8_ = auVar245._0_8_;
    auVar363._12_4_ = 0;
    auVar277 = maxps(auVar363,auVar244);
    auVar338 = maxps(auVar164,auVar277);
    auVar277 = minps(auVar278,_local_5d8);
    auVar164 = minps(auVar245,auVar244);
    auVar277 = minps(auVar277,auVar164);
    auVar164 = sqrtps(auVar164,auVar326);
    auVar326 = rsqrtps(auVar420,auVar355);
    fVar315 = auVar326._0_4_;
    fVar369 = auVar326._4_4_;
    fVar377 = auVar326._8_4_;
    fVar404 = auVar326._12_4_;
    local_318._0_4_ = fVar315 * fVar315 * auVar355._0_4_ * -0.5 * fVar315 + fVar315 * 1.5;
    local_318._4_4_ = fVar369 * fVar369 * auVar355._4_4_ * -0.5 * fVar369 + fVar369 * 1.5;
    fStack_310 = fVar377 * fVar377 * auVar355._8_4_ * -0.5 * fVar377 + fVar377 * 1.5;
    fStack_30c = fVar404 * fVar404 * auVar355._12_4_ * -0.5 * fVar404 + fVar404 * 1.5;
    fVar361 = 0.0 - fVar427;
    fVar370 = 0.0 - fVar436;
    fVar378 = 0.0 - fVar439;
    fVar379 = 0.0 - fVar442;
    fVar335 = 0.0 - fVar405;
    fVar336 = 0.0 - fVar413;
    fVar344 = 0.0 - fVar416;
    fVar345 = 0.0 - fVar418;
    fVar393 = 0.0 - local_498;
    fVar398 = 0.0 - fStack_494;
    fVar401 = 0.0 - fStack_490;
    fVar403 = 0.0 - fStack_48c;
    auVar430._0_4_ = local_308 * fVar393 + fVar285 * fVar361 + fVar288 * fVar335;
    auVar430._4_4_ = fStack_304 * fVar398 + fVar285 * fVar370 + fVar288 * fVar336;
    auVar430._8_4_ = fStack_300 * fVar401 + fVar285 * fVar378 + fVar288 * fVar344;
    auVar430._12_4_ = fStack_2fc * fVar403 + fVar285 * fVar379 + fVar288 * fVar345;
    fVar346 = local_308 * fVar446 * (float)local_318._0_4_ +
              fVar285 * fVar400 * (float)local_318._0_4_ +
              fVar288 * fVar438 * (float)local_318._0_4_;
    fVar347 = fStack_304 * fVar449 * (float)local_318._4_4_ +
              fVar285 * fVar402 * (float)local_318._4_4_ +
              fVar288 * fVar445 * (float)local_318._4_4_;
    fVar359 = fStack_300 * fVar452 * fStack_310 +
              fVar285 * fVar426 * fStack_310 + fVar288 * fVar448 * fStack_310;
    fVar360 = fStack_2fc * fVar454 * fStack_30c +
              fVar285 * fVar435 * fStack_30c + fVar288 * fVar451 * fStack_30c;
    local_338 = fVar446 * (float)local_318._0_4_ * fVar393 +
                fVar400 * (float)local_318._0_4_ * fVar361 +
                fVar438 * (float)local_318._0_4_ * fVar335;
    fStack_334 = fVar449 * (float)local_318._4_4_ * fVar398 +
                 fVar402 * (float)local_318._4_4_ * fVar370 +
                 fVar445 * (float)local_318._4_4_ * fVar336;
    fStack_330 = fVar452 * fStack_310 * fVar401 +
                 fVar426 * fStack_310 * fVar378 + fVar448 * fStack_310 * fVar344;
    fStack_32c = fVar454 * fStack_30c * fVar403 +
                 fVar435 * fStack_30c * fVar379 + fVar451 * fStack_30c * fVar345;
    fVar424 = auVar430._0_4_ - fVar346 * local_338;
    fVar425 = auVar430._4_4_ - fVar347 * fStack_334;
    fVar428 = auVar430._8_4_ - fVar359 * fStack_330;
    fVar437 = auVar430._12_4_ - fVar360 * fStack_32c;
    fVar315 = (fVar393 * fVar393 + fVar361 * fVar361 + fVar335 * fVar335) - local_338 * local_338;
    fVar369 = (fVar398 * fVar398 + fVar370 * fVar370 + fVar336 * fVar336) - fStack_334 * fStack_334;
    fVar377 = (fVar401 * fVar401 + fVar378 * fVar378 + fVar344 * fVar344) - fStack_330 * fStack_330;
    fVar404 = (fVar403 * fVar403 + fVar379 * fVar379 + fVar345 * fVar345) - fStack_32c * fStack_32c;
    fVar441 = (auVar338._0_4_ + auVar164._0_4_) * 1.0000002;
    fVar447 = (auVar338._4_4_ + auVar164._4_4_) * 1.0000002;
    fVar450 = (auVar338._8_4_ + auVar164._8_4_) * 1.0000002;
    fVar453 = (auVar338._12_4_ + auVar164._12_4_) * 1.0000002;
    local_4a8._0_4_ = fVar315 - fVar441 * fVar441;
    local_4a8._4_4_ = fVar369 - fVar447 * fVar447;
    fStack_4a0 = fVar377 - fVar450 * fVar450;
    fStack_49c = fVar404 - fVar453 * fVar453;
    auVar364._0_4_ = fVar267 - fVar346 * fVar346;
    auVar364._4_4_ = fVar269 - fVar347 * fVar347;
    auVar364._8_4_ = fVar313 - fVar359 * fVar359;
    auVar364._12_4_ = fVar358 - fVar360 * fVar360;
    fVar424 = fVar424 + fVar424;
    fVar425 = fVar425 + fVar425;
    fVar428 = fVar428 + fVar428;
    fVar437 = fVar437 + fVar437;
    auVar246._0_4_ = fVar424 * fVar424 - auVar364._0_4_ * 4.0 * (float)local_4a8._0_4_;
    auVar246._4_4_ = fVar425 * fVar425 - auVar364._4_4_ * 4.0 * (float)local_4a8._4_4_;
    auVar246._8_4_ = fVar428 * fVar428 - auVar364._8_4_ * 4.0 * fStack_4a0;
    auVar246._12_4_ = fVar437 * fVar437 - auVar364._12_4_ * 4.0 * fStack_49c;
    local_3f8._4_4_ = (auVar277._4_4_ - auVar164._4_4_) * 0.99999976;
    local_3f8._0_4_ = (auVar277._0_4_ - auVar164._0_4_) * 0.99999976;
    fStack_3f0 = (auVar277._8_4_ - auVar164._8_4_) * 0.99999976;
    fStack_3ec = (auVar277._12_4_ - auVar164._12_4_) * 0.99999976;
    auVar327._4_4_ = -(uint)(0.0 <= auVar246._4_4_);
    auVar327._0_4_ = -(uint)(0.0 <= auVar246._0_4_);
    auVar327._8_4_ = -(uint)(0.0 <= auVar246._8_4_);
    auVar327._12_4_ = -(uint)(0.0 <= auVar246._12_4_);
    iVar148 = movmskps((int)pSVar129,auVar327);
    fStack_4c0 = -fVar428;
    fStack_4bc = -fVar437;
    local_328._0_8_ = CONCAT44(fVar347 * fVar347,fVar346 * fVar346) & 0x7fffffff7fffffff;
    local_328._8_4_ = ABS(fVar359 * fVar359);
    local_328._12_4_ = ABS(fVar360 * fVar360);
    fVar441 = ABS(auVar364._0_4_);
    fVar447 = ABS(auVar364._4_4_);
    fVar450 = ABS(auVar364._8_4_);
    fVar453 = ABS(auVar364._12_4_);
    local_4c8 = (undefined1  [8])(CONCAT44(fVar425,fVar424) ^ 0x8000000080000000);
    if (iVar148 == 0) {
      iVar148 = 0;
      auVar365 = _DAT_01f45a40;
      auVar421 = _DAT_01f45a30;
    }
    else {
      auVar277 = sqrtps(auVar430,auVar246);
      bVar139 = 0.0 <= auVar246._0_4_;
      uVar142 = -(uint)bVar139;
      bVar32 = 0.0 <= auVar246._4_4_;
      uVar144 = -(uint)bVar32;
      bVar33 = 0.0 <= auVar246._8_4_;
      uVar143 = -(uint)bVar33;
      bVar34 = 0.0 <= auVar246._12_4_;
      uVar145 = -(uint)bVar34;
      auVar339._0_4_ = auVar364._0_4_ + auVar364._0_4_;
      auVar339._4_4_ = auVar364._4_4_ + auVar364._4_4_;
      auVar339._8_4_ = auVar364._8_4_ + auVar364._8_4_;
      auVar339._12_4_ = auVar364._12_4_ + auVar364._12_4_;
      auVar164 = rcpps(auVar364,auVar339);
      fVar406 = auVar164._0_4_;
      fVar414 = auVar164._4_4_;
      fVar417 = auVar164._8_4_;
      fVar419 = auVar164._12_4_;
      fVar406 = (1.0 - auVar339._0_4_ * fVar406) * fVar406 + fVar406;
      fVar414 = (1.0 - auVar339._4_4_ * fVar414) * fVar414 + fVar414;
      fVar417 = (1.0 - auVar339._8_4_ * fVar417) * fVar417 + fVar417;
      fVar419 = (1.0 - auVar339._12_4_ * fVar419) * fVar419 + fVar419;
      fVar440 = (-fVar424 - auVar277._0_4_) * fVar406;
      fVar443 = (-fVar425 - auVar277._4_4_) * fVar414;
      fVar286 = (fStack_4c0 - auVar277._8_4_) * fVar417;
      fVar287 = (fStack_4bc - auVar277._12_4_) * fVar419;
      fVar406 = (auVar277._0_4_ - fVar424) * fVar406;
      fVar414 = (auVar277._4_4_ - fVar425) * fVar414;
      fVar417 = (auVar277._8_4_ - fVar428) * fVar417;
      fVar419 = (auVar277._12_4_ - fVar437) * fVar419;
      local_218 = (fVar346 * fVar440 + local_338) * (float)local_318._0_4_;
      fStack_214 = (fVar347 * fVar443 + fStack_334) * (float)local_318._4_4_;
      fStack_210 = (fVar359 * fVar286 + fStack_330) * fStack_310;
      fStack_20c = (fVar360 * fVar287 + fStack_32c) * fStack_30c;
      local_208 = (fVar346 * fVar406 + local_338) * (float)local_318._0_4_;
      fStack_204 = (fVar347 * fVar414 + fStack_334) * (float)local_318._4_4_;
      fStack_200 = (fVar359 * fVar417 + fStack_330) * fStack_310;
      fStack_1fc = (fVar360 * fVar419 + fStack_32c) * fStack_30c;
      auVar279._0_4_ = (uint)fVar440 & uVar142;
      auVar279._4_4_ = (uint)fVar443 & uVar144;
      auVar279._8_4_ = (uint)fVar286 & uVar143;
      auVar279._12_4_ = (uint)fVar287 & uVar145;
      auVar421._0_8_ = CONCAT44(~uVar144,~uVar142) & 0x7f8000007f800000;
      auVar421._8_4_ = ~uVar143 & 0x7f800000;
      auVar421._12_4_ = ~uVar145 & 0x7f800000;
      auVar421 = auVar421 | auVar279;
      auVar431._0_4_ = (uint)fVar406 & uVar142;
      auVar431._4_4_ = (uint)fVar414 & uVar144;
      auVar431._8_4_ = (uint)fVar417 & uVar143;
      auVar431._12_4_ = (uint)fVar419 & uVar145;
      auVar365._0_8_ = CONCAT44(~uVar144,~uVar142) & 0xff800000ff800000;
      auVar365._8_4_ = ~uVar143 & 0xff800000;
      auVar365._12_4_ = ~uVar145 & 0xff800000;
      auVar365 = auVar365 | auVar431;
      auVar88._4_4_ = fStack_2d4;
      auVar88._0_4_ = local_2d8;
      auVar88._8_4_ = fStack_2d0;
      auVar88._12_4_ = fStack_2cc;
      auVar164 = maxps(auVar88,local_328);
      fVar440 = auVar164._0_4_ * 1.9073486e-06;
      fVar443 = auVar164._4_4_ * 1.9073486e-06;
      fVar286 = auVar164._8_4_ * 1.9073486e-06;
      fVar287 = auVar164._12_4_ * 1.9073486e-06;
      auVar432._0_4_ = -(uint)(fVar441 < fVar440 && bVar139);
      auVar432._4_4_ = -(uint)(fVar447 < fVar443 && bVar32);
      auVar432._8_4_ = -(uint)(fVar450 < fVar286 && bVar33);
      auVar432._12_4_ = -(uint)(fVar453 < fVar287 && bVar34);
      iVar148 = movmskps(iVar148,auVar432);
      if (iVar148 != 0) {
        uVar142 = -(uint)((float)local_4a8._0_4_ <= 0.0);
        uVar144 = -(uint)((float)local_4a8._4_4_ <= 0.0);
        uVar143 = -(uint)(fStack_4a0 <= 0.0);
        uVar145 = -(uint)(fStack_49c <= 0.0);
        auVar328._0_4_ = (uVar142 & 0xff800000 | ~uVar142 & 0x7f800000) & auVar432._0_4_;
        auVar328._4_4_ = (uVar144 & 0xff800000 | ~uVar144 & 0x7f800000) & auVar432._4_4_;
        auVar328._8_4_ = (uVar143 & 0xff800000 | ~uVar143 & 0x7f800000) & auVar432._8_4_;
        auVar328._12_4_ = (uVar145 & 0xff800000 | ~uVar145 & 0x7f800000) & auVar432._12_4_;
        auVar408._0_4_ = ~auVar432._0_4_ & auVar421._0_4_;
        auVar408._4_4_ = ~auVar432._4_4_ & auVar421._4_4_;
        auVar408._8_4_ = ~auVar432._8_4_ & auVar421._8_4_;
        auVar408._12_4_ = ~auVar432._12_4_ & auVar421._12_4_;
        auVar422._0_4_ = (uVar142 & 0x7f800000 | ~uVar142 & 0xff800000) & auVar432._0_4_;
        auVar422._4_4_ = (uVar144 & 0x7f800000 | ~uVar144 & 0xff800000) & auVar432._4_4_;
        auVar422._8_4_ = (uVar143 & 0x7f800000 | ~uVar143 & 0xff800000) & auVar432._8_4_;
        auVar422._12_4_ = (uVar145 & 0x7f800000 | ~uVar145 & 0xff800000) & auVar432._12_4_;
        auVar433._0_4_ = ~auVar432._0_4_ & auVar365._0_4_;
        auVar433._4_4_ = ~auVar432._4_4_ & auVar365._4_4_;
        auVar433._8_4_ = ~auVar432._8_4_ & auVar365._8_4_;
        auVar433._12_4_ = ~auVar432._12_4_ & auVar365._12_4_;
        auVar327._4_4_ = -(uint)((fVar443 <= fVar447 || (float)local_4a8._4_4_ <= 0.0) && bVar32);
        auVar327._0_4_ = -(uint)((fVar440 <= fVar441 || (float)local_4a8._0_4_ <= 0.0) && bVar139);
        auVar327._8_4_ = -(uint)((fVar286 <= fVar450 || fStack_4a0 <= 0.0) && bVar33);
        auVar327._12_4_ = -(uint)((fVar287 <= fVar453 || fStack_49c <= 0.0) && bVar34);
        auVar365 = auVar433 | auVar422;
        auVar421 = auVar408 | auVar328;
      }
    }
    auVar329._0_4_ = (auVar327._0_4_ << 0x1f) >> 0x1f;
    auVar329._4_4_ = (auVar327._4_4_ << 0x1f) >> 0x1f;
    auVar329._8_4_ = (auVar327._8_4_ << 0x1f) >> 0x1f;
    auVar329._12_4_ = (auVar327._12_4_ << 0x1f) >> 0x1f;
    auVar329 = auVar329 & auVar243;
    iVar148 = movmskps(iVar148,auVar329);
    if (iVar148 != 0) {
      auVar181._0_4_ = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_2f8._0_4_;
      auVar181._4_4_ = auVar181._0_4_;
      auVar181._8_4_ = auVar181._0_4_;
      auVar181._12_4_ = auVar181._0_4_;
      auVar164 = maxps(auVar181,auVar421);
      auVar409._0_4_ = (ray->super_RayK<1>).tfar - (float)local_2f8._0_4_;
      auVar409._4_4_ = auVar409._0_4_;
      auVar409._8_4_ = auVar409._0_4_;
      auVar409._12_4_ = auVar409._0_4_;
      auVar326 = minps(auVar409,auVar365);
      auVar247._0_4_ = fVar388 * fVar285 + fVar380 * fVar288;
      auVar247._4_4_ = fVar392 * fVar285 + fVar381 * fVar288;
      auVar247._8_4_ = fVar387 * fVar285 + fVar385 * fVar288;
      auVar247._12_4_ = fVar389 * fVar285 + fVar386 * fVar288;
      auVar372._0_4_ = fVar412 * local_308 + auVar247._0_4_;
      auVar372._4_4_ = fVar444 * fStack_304 + auVar247._4_4_;
      auVar372._8_4_ = fVar391 * fStack_300 + auVar247._8_4_;
      auVar372._12_4_ = fVar397 * fStack_2fc + auVar247._12_4_;
      auVar277 = rcpps(auVar247,auVar372);
      fVar440 = auVar277._0_4_;
      fVar443 = auVar277._4_4_;
      fVar286 = auVar277._8_4_;
      fVar287 = auVar277._12_4_;
      fVar412 = ((1.0 - auVar372._0_4_ * fVar440) * fVar440 + fVar440) *
                -(fVar393 * fVar412 + fVar361 * fVar388 + fVar335 * fVar380);
      fVar335 = ((1.0 - auVar372._4_4_ * fVar443) * fVar443 + fVar443) *
                -(fVar398 * fVar444 + fVar370 * fVar392 + fVar336 * fVar381);
      fVar336 = ((1.0 - auVar372._8_4_ * fVar286) * fVar286 + fVar286) *
                -(fVar401 * fVar391 + fVar378 * fVar387 + fVar344 * fVar385);
      fVar344 = ((1.0 - auVar372._12_4_ * fVar287) * fVar287 + fVar287) *
                -(fVar403 * fVar397 + fVar379 * fVar389 + fVar345 * fVar386);
      uVar142 = -(uint)(auVar372._0_4_ < 0.0 || ABS(auVar372._0_4_) < 1e-18);
      uVar144 = -(uint)(auVar372._4_4_ < 0.0 || ABS(auVar372._4_4_) < 1e-18);
      uVar143 = -(uint)(auVar372._8_4_ < 0.0 || ABS(auVar372._8_4_) < 1e-18);
      uVar145 = -(uint)(auVar372._12_4_ < 0.0 || ABS(auVar372._12_4_) < 1e-18);
      auVar298._0_8_ = CONCAT44(uVar144,uVar142) & 0xff800000ff800000;
      auVar298._8_4_ = uVar143 & 0xff800000;
      auVar298._12_4_ = uVar145 & 0xff800000;
      auVar248._0_4_ = ~uVar142 & (uint)fVar412;
      auVar248._4_4_ = ~uVar144 & (uint)fVar335;
      auVar248._8_4_ = ~uVar143 & (uint)fVar336;
      auVar248._12_4_ = ~uVar145 & (uint)fVar344;
      auVar164 = maxps(auVar164,auVar248 | auVar298);
      uVar142 = -(uint)(0.0 < auVar372._0_4_ || ABS(auVar372._0_4_) < 1e-18);
      uVar144 = -(uint)(0.0 < auVar372._4_4_ || ABS(auVar372._4_4_) < 1e-18);
      uVar143 = -(uint)(0.0 < auVar372._8_4_ || ABS(auVar372._8_4_) < 1e-18);
      uVar145 = -(uint)(0.0 < auVar372._12_4_ || ABS(auVar372._12_4_) < 1e-18);
      auVar249._0_4_ = (uint)DAT_01f45a30 & uVar142;
      auVar249._4_4_ = DAT_01f45a30._4_4_ & uVar144;
      auVar249._8_4_ = DAT_01f45a30._8_4_ & uVar143;
      auVar249._12_4_ = DAT_01f45a30._12_4_ & uVar145;
      auVar373._0_4_ = ~uVar142 & (uint)fVar412;
      auVar373._4_4_ = ~uVar144 & (uint)fVar335;
      auVar373._8_4_ = ~uVar143 & (uint)fVar336;
      auVar373._12_4_ = ~uVar145 & (uint)fVar344;
      auVar326 = minps(auVar326,auVar373 | auVar249);
      auVar299._0_4_ = (0.0 - fVar436) * -fVar392 + (0.0 - fVar413) * -fVar381;
      auVar299._4_4_ = (0.0 - fVar439) * -fVar387 + (0.0 - fVar416) * -fVar385;
      auVar299._8_4_ = (0.0 - fVar442) * -fVar389 + (0.0 - fVar418) * -fVar386;
      auVar299._12_4_ = 0x80000000;
      auVar374._0_4_ = -fVar444 * local_308 + -fVar392 * fVar285 + -fVar381 * fVar288;
      auVar374._4_4_ = -fVar391 * fStack_304 + -fVar387 * fVar285 + -fVar385 * fVar288;
      auVar374._8_4_ = -fVar397 * fStack_300 + -fVar389 * fVar285 + -fVar386 * fVar288;
      auVar374._12_4_ = fStack_2fc * -0.0 + fVar285 * -0.0 + fVar288 * -0.0;
      auVar277 = rcpps(auVar299,auVar374);
      fVar412 = auVar277._0_4_;
      fVar335 = auVar277._4_4_;
      fVar336 = auVar277._8_4_;
      fVar344 = auVar277._12_4_;
      fVar412 = (((float)DAT_01f46a60 - auVar374._0_4_ * fVar412) * fVar412 + fVar412) *
                -((0.0 - fStack_494) * -fVar444 + auVar299._0_4_);
      fVar444 = ((DAT_01f46a60._4_4_ - auVar374._4_4_ * fVar335) * fVar335 + fVar335) *
                -((0.0 - fStack_490) * -fVar391 + auVar299._4_4_);
      fVar391 = ((DAT_01f46a60._8_4_ - auVar374._8_4_ * fVar336) * fVar336 + fVar336) *
                -((0.0 - fStack_48c) * -fVar397 + auVar299._8_4_);
      fVar397 = ((DAT_01f46a60._12_4_ - auVar374._12_4_ * fVar344) * fVar344 + fVar344) * 0.0;
      uVar142 = -(uint)(auVar374._0_4_ < 0.0 || ABS(auVar374._0_4_) < 1e-18);
      uVar144 = -(uint)(auVar374._4_4_ < 0.0 || ABS(auVar374._4_4_) < 1e-18);
      uVar143 = -(uint)(auVar374._8_4_ < 0.0 || ABS(auVar374._8_4_) < 1e-18);
      uVar145 = -(uint)(auVar374._12_4_ < 0.0 || ABS(auVar374._12_4_) < 1e-18);
      auVar300._0_8_ = CONCAT44(uVar144,uVar142) & 0xff800000ff800000;
      auVar300._8_4_ = uVar143 & 0xff800000;
      auVar300._12_4_ = uVar145 & 0xff800000;
      auVar250._0_4_ = ~uVar142 & (uint)fVar412;
      auVar250._4_4_ = ~uVar144 & (uint)fVar444;
      auVar250._8_4_ = ~uVar143 & (uint)fVar391;
      auVar250._12_4_ = ~uVar145 & (uint)fVar397;
      _local_4a8 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   maxps(auVar164,auVar250 | auVar300);
      uVar142 = -(uint)(0.0 < auVar374._0_4_ || ABS(auVar374._0_4_) < 1e-18);
      uVar144 = -(uint)(0.0 < auVar374._4_4_ || ABS(auVar374._4_4_) < 1e-18);
      uVar143 = -(uint)(0.0 < auVar374._8_4_ || ABS(auVar374._8_4_) < 1e-18);
      uVar145 = -(uint)(0.0 < auVar374._12_4_ || ABS(auVar374._12_4_) < 1e-18);
      auVar251._0_4_ = (uint)DAT_01f45a30 & uVar142;
      auVar251._4_4_ = DAT_01f45a30._4_4_ & uVar144;
      auVar251._8_4_ = DAT_01f45a30._8_4_ & uVar143;
      auVar251._12_4_ = DAT_01f45a30._12_4_ & uVar145;
      auVar375._0_4_ = ~uVar142 & (uint)fVar412;
      auVar375._4_4_ = ~uVar144 & (uint)fVar444;
      auVar375._8_4_ = ~uVar143 & (uint)fVar391;
      auVar375._12_4_ = ~uVar145 & (uint)fVar397;
      aVar410 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar326,auVar375 | auVar251);
      fVar412 = local_4a8._12_4_;
      fVar444 = local_4a8._0_4_;
      fVar391 = local_4a8._4_4_;
      fVar397 = local_4a8._8_4_;
      auVar434._0_4_ = -(uint)(fVar444 <= aVar410.v[0]) & auVar329._0_4_;
      auVar434._4_4_ = -(uint)(fVar391 <= aVar410.v[1]) & auVar329._4_4_;
      auVar434._8_4_ = -(uint)(fVar397 <= aVar410.v[2]) & auVar329._8_4_;
      auVar434._12_4_ = -(uint)(fVar412 <= aVar410.v[3]) & auVar329._12_4_;
      iVar148 = movmskps(iVar148,auVar434);
      if (iVar148 != 0) {
        auVar277 = maxps(ZEXT816(0),_local_3f8);
        auVar90._4_4_ = fStack_214;
        auVar90._0_4_ = local_218;
        auVar90._8_4_ = fStack_210;
        auVar90._12_4_ = fStack_20c;
        auVar164 = minps(auVar90,_DAT_01f46a60);
        auVar317._0_12_ = ZEXT812(0);
        auVar317._12_4_ = 0.0;
        auVar326 = maxps(auVar164,auVar317);
        auVar91._4_4_ = fStack_204;
        auVar91._0_4_ = local_208;
        auVar91._8_4_ = fStack_200;
        auVar91._12_4_ = fStack_1fc;
        auVar164 = minps(auVar91,_DAT_01f46a60);
        auVar164 = maxps(auVar164,auVar317);
        local_108._0_4_ = (auVar326._0_4_ + 0.0) * 0.25 * fVar415 + fVar399;
        local_108._4_4_ = (auVar326._4_4_ + 1.0) * 0.25 * fVar415 + fVar399;
        local_108._8_4_ = (auVar326._8_4_ + 2.0) * 0.25 * fVar415 + fVar399;
        local_108._12_4_ = (auVar326._12_4_ + 3.0) * 0.25 * fVar415 + fVar399;
        local_118[0] = (auVar164._0_4_ + 0.0) * 0.25 * fVar415 + fVar399;
        local_118[1] = (auVar164._4_4_ + 1.0) * 0.25 * fVar415 + fVar399;
        local_118[2] = (auVar164._8_4_ + 2.0) * 0.25 * fVar415 + fVar399;
        local_118[3] = (auVar164._12_4_ + 3.0) * 0.25 * fVar415 + fVar399;
        fVar315 = fVar315 - auVar277._0_4_ * auVar277._0_4_;
        fVar369 = fVar369 - auVar277._4_4_ * auVar277._4_4_;
        fVar377 = fVar377 - auVar277._8_4_ * auVar277._8_4_;
        fVar404 = fVar404 - auVar277._12_4_ * auVar277._12_4_;
        auVar280._0_4_ = auVar364._0_4_ * 4.0 * fVar315;
        auVar280._4_4_ = auVar364._4_4_ * 4.0 * fVar369;
        auVar280._8_4_ = auVar364._8_4_ * 4.0 * fVar377;
        auVar280._12_4_ = auVar364._12_4_ * 4.0 * fVar404;
        auVar182._0_4_ = fVar424 * fVar424 - auVar280._0_4_;
        auVar182._4_4_ = fVar425 * fVar425 - auVar280._4_4_;
        auVar182._8_4_ = fVar428 * fVar428 - auVar280._8_4_;
        auVar182._12_4_ = fVar437 * fVar437 - auVar280._12_4_;
        auVar395._4_4_ = -(uint)(0.0 <= auVar182._4_4_);
        auVar395._0_4_ = -(uint)(0.0 <= auVar182._0_4_);
        auVar395._8_4_ = -(uint)(0.0 <= auVar182._8_4_);
        auVar395._12_4_ = -(uint)(0.0 <= auVar182._12_4_);
        iVar148 = movmskps(iVar148,auVar395);
        if (iVar148 == 0) {
          _local_578 = ZEXT816(0);
          fVar400 = 0.0;
          fVar402 = 0.0;
          fVar426 = 0.0;
          fVar435 = 0.0;
          fVar345 = 0.0;
          fVar361 = 0.0;
          fVar370 = 0.0;
          fVar378 = 0.0;
          fVar415 = 0.0;
          fVar335 = 0.0;
          fVar336 = 0.0;
          fVar344 = 0.0;
          _local_4c8 = ZEXT816(0);
          iVar148 = 0;
          auVar356 = _DAT_01f45a40;
          auVar366 = _DAT_01f45a30;
        }
        else {
          auVar277 = sqrtps(local_108,auVar182);
          auVar252._0_4_ = auVar364._0_4_ + auVar364._0_4_;
          auVar252._4_4_ = auVar364._4_4_ + auVar364._4_4_;
          auVar252._8_4_ = auVar364._8_4_ + auVar364._8_4_;
          auVar252._12_4_ = auVar364._12_4_ + auVar364._12_4_;
          auVar164 = rcpps(auVar280,auVar252);
          fVar379 = auVar164._0_4_;
          fVar380 = auVar164._4_4_;
          fVar381 = auVar164._8_4_;
          fVar385 = auVar164._12_4_;
          fVar379 = ((float)DAT_01f46a60 - auVar252._0_4_ * fVar379) * fVar379 + fVar379;
          fVar380 = (DAT_01f46a60._4_4_ - auVar252._4_4_ * fVar380) * fVar380 + fVar380;
          fVar381 = (DAT_01f46a60._8_4_ - auVar252._8_4_ * fVar381) * fVar381 + fVar381;
          fVar385 = (DAT_01f46a60._12_4_ - auVar252._12_4_ * fVar385) * fVar385 + fVar385;
          fVar389 = ((float)local_4c8._0_4_ - auVar277._0_4_) * fVar379;
          fVar393 = ((float)local_4c8._4_4_ - auVar277._4_4_) * fVar380;
          fVar398 = (fStack_4c0 - auVar277._8_4_) * fVar381;
          fVar401 = (fStack_4bc - auVar277._12_4_) * fVar385;
          fVar379 = (auVar277._0_4_ - fVar424) * fVar379;
          fVar380 = (auVar277._4_4_ - fVar425) * fVar380;
          fVar381 = (auVar277._8_4_ - fVar428) * fVar381;
          fVar385 = (auVar277._12_4_ - fVar437) * fVar385;
          fVar386 = (fVar346 * fVar389 + local_338) * (float)local_318._0_4_;
          fVar388 = (fVar347 * fVar393 + fStack_334) * (float)local_318._4_4_;
          fVar392 = (fVar359 * fVar398 + fStack_330) * fStack_310;
          fVar387 = (fVar360 * fVar401 + fStack_32c) * fStack_30c;
          fVar345 = local_308 * fVar389 - (fVar446 * fVar386 + local_498);
          fVar361 = fStack_304 * fVar393 - (fVar449 * fVar388 + fStack_494);
          fVar370 = fStack_300 * fVar398 - (fVar452 * fVar392 + fStack_490);
          fVar378 = fStack_2fc * fVar401 - (fVar454 * fVar387 + fStack_48c);
          fVar415 = fVar285 * fVar389 - (fVar400 * fVar386 + fVar427);
          fVar335 = fVar285 * fVar393 - (fVar402 * fVar388 + fVar436);
          fVar336 = fVar285 * fVar398 - (fVar426 * fVar392 + fVar439);
          fVar344 = fVar285 * fVar401 - (fVar435 * fVar387 + fVar442);
          local_4c8._4_4_ = fVar288 * fVar393 - (fVar388 * fVar445 + fVar413);
          local_4c8._0_4_ = fVar288 * fVar389 - (fVar386 * fVar438 + fVar405);
          fStack_4c0 = fVar288 * fVar398 - (fVar392 * fVar448 + fVar416);
          fStack_4bc = fVar288 * fVar401 - (fVar387 * fVar451 + fVar418);
          local_318._0_4_ = (fVar346 * fVar379 + local_338) * (float)local_318._0_4_;
          local_318._4_4_ = (fVar347 * fVar380 + fStack_334) * (float)local_318._4_4_;
          fStack_310 = (fVar359 * fVar381 + fStack_330) * fStack_310;
          fStack_30c = (fVar360 * fVar385 + fStack_32c) * fStack_30c;
          local_578._4_4_ = fStack_304 * fVar380 - (fVar449 * (float)local_318._4_4_ + fStack_494);
          local_578._0_4_ = local_308 * fVar379 - (fVar446 * (float)local_318._0_4_ + local_498);
          fStack_570 = fStack_300 * fVar381 - (fVar452 * fStack_310 + fStack_490);
          fStack_56c = fStack_2fc * fVar385 - (fVar454 * fStack_30c + fStack_48c);
          auVar317._0_4_ = fVar285 * fVar379 - (fVar400 * (float)local_318._0_4_ + fVar427);
          auVar317._4_4_ = fVar285 * fVar380 - (fVar402 * (float)local_318._4_4_ + fVar436);
          auVar317._8_4_ = fVar285 * fVar381 - (fVar426 * fStack_310 + fVar439);
          auVar317._12_4_ = fVar285 * fVar385 - (fVar435 * fStack_30c + fVar442);
          bVar139 = 0.0 <= auVar182._0_4_;
          uVar142 = -(uint)bVar139;
          bVar32 = 0.0 <= auVar182._4_4_;
          uVar144 = -(uint)bVar32;
          bVar33 = 0.0 <= auVar182._8_4_;
          uVar143 = -(uint)bVar33;
          bVar34 = 0.0 <= auVar182._12_4_;
          uVar145 = -(uint)bVar34;
          fVar400 = fVar288 * fVar379 - ((float)local_318._0_4_ * fVar438 + fVar405);
          fVar402 = fVar288 * fVar380 - ((float)local_318._4_4_ * fVar445 + fVar413);
          fVar426 = fVar288 * fVar381 - (fStack_310 * fVar448 + fVar416);
          fVar435 = fVar288 * fVar385 - (fStack_30c * fVar451 + fVar418);
          auVar411._0_4_ = (uint)fVar389 & uVar142;
          auVar411._4_4_ = (uint)fVar393 & uVar144;
          auVar411._8_4_ = (uint)fVar398 & uVar143;
          auVar411._12_4_ = (uint)fVar401 & uVar145;
          auVar366._0_8_ = CONCAT44(~uVar144,~uVar142) & 0x7f8000007f800000;
          auVar366._8_4_ = ~uVar143 & 0x7f800000;
          auVar366._12_4_ = ~uVar145 & 0x7f800000;
          auVar366 = auVar366 | auVar411;
          auVar340._0_4_ = (uint)fVar379 & uVar142;
          auVar340._4_4_ = (uint)fVar380 & uVar144;
          auVar340._8_4_ = (uint)fVar381 & uVar143;
          auVar340._12_4_ = (uint)fVar385 & uVar145;
          auVar356._0_8_ = CONCAT44(~uVar144,~uVar142) & 0xff800000ff800000;
          auVar356._8_4_ = ~uVar143 & 0xff800000;
          auVar356._12_4_ = ~uVar145 & 0xff800000;
          auVar356 = auVar356 | auVar340;
          auVar89._4_4_ = fStack_2d4;
          auVar89._0_4_ = local_2d8;
          auVar89._8_4_ = fStack_2d0;
          auVar89._12_4_ = fStack_2cc;
          auVar164 = maxps(auVar89,local_328);
          fVar438 = auVar164._0_4_ * 1.9073486e-06;
          fVar445 = auVar164._4_4_ * 1.9073486e-06;
          fVar448 = auVar164._8_4_ * 1.9073486e-06;
          fVar451 = auVar164._12_4_ * 1.9073486e-06;
          auVar341._0_4_ = -(uint)(fVar441 < fVar438 && bVar139);
          auVar341._4_4_ = -(uint)(fVar447 < fVar445 && bVar32);
          auVar341._8_4_ = -(uint)(fVar450 < fVar448 && bVar33);
          auVar341._12_4_ = -(uint)(fVar453 < fVar451 && bVar34);
          iVar148 = movmskps(iVar148,auVar341);
          if (iVar148 != 0) {
            uVar142 = -(uint)(fVar315 <= 0.0);
            uVar144 = -(uint)(fVar369 <= 0.0);
            uVar143 = -(uint)(fVar377 <= 0.0);
            uVar145 = -(uint)(fVar404 <= 0.0);
            auVar376._0_4_ = (uVar142 & 0xff800000 | ~uVar142 & 0x7f800000) & auVar341._0_4_;
            auVar376._4_4_ = (uVar144 & 0xff800000 | ~uVar144 & 0x7f800000) & auVar341._4_4_;
            auVar376._8_4_ = (uVar143 & 0xff800000 | ~uVar143 & 0x7f800000) & auVar341._8_4_;
            auVar376._12_4_ = (uVar145 & 0xff800000 | ~uVar145 & 0x7f800000) & auVar341._12_4_;
            auVar383._0_4_ = ~auVar341._0_4_ & auVar366._0_4_;
            auVar383._4_4_ = ~auVar341._4_4_ & auVar366._4_4_;
            auVar383._8_4_ = ~auVar341._8_4_ & auVar366._8_4_;
            auVar383._12_4_ = ~auVar341._12_4_ & auVar366._12_4_;
            auVar366 = auVar383 | auVar376;
            auVar368._0_4_ = (uVar142 & 0x7f800000 | ~uVar142 & 0xff800000) & auVar341._0_4_;
            auVar368._4_4_ = (uVar144 & 0x7f800000 | ~uVar144 & 0xff800000) & auVar341._4_4_;
            auVar368._8_4_ = (uVar143 & 0x7f800000 | ~uVar143 & 0xff800000) & auVar341._8_4_;
            auVar368._12_4_ = (uVar145 & 0x7f800000 | ~uVar145 & 0xff800000) & auVar341._12_4_;
            auVar342._0_4_ = ~auVar341._0_4_ & auVar356._0_4_;
            auVar342._4_4_ = ~auVar341._4_4_ & auVar356._4_4_;
            auVar342._8_4_ = ~auVar341._8_4_ & auVar356._8_4_;
            auVar342._12_4_ = ~auVar341._12_4_ & auVar356._12_4_;
            auVar356 = auVar342 | auVar368;
            auVar395._4_4_ = -(uint)((fVar445 <= fVar447 || fVar369 <= 0.0) && bVar32);
            auVar395._0_4_ = -(uint)((fVar438 <= fVar441 || fVar315 <= 0.0) && bVar139);
            auVar395._8_4_ = -(uint)((fVar448 <= fVar450 || fVar377 <= 0.0) && bVar33);
            auVar395._12_4_ = -(uint)((fVar451 <= fVar453 || fVar404 <= 0.0) && bVar34);
          }
        }
        fVar315 = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar369 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar377 = (ray->super_RayK<1>).dir.field_0.m128[2];
        auVar164 = minps((undefined1  [16])aVar410,auVar366);
        aVar367 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                  maxps((undefined1  [16])_local_4a8,auVar356);
        tp1.lower.field_0 = aVar367;
        tp1.upper.field_0 = aVar410;
        auVar357._0_4_ = -(uint)(fVar444 <= auVar164._0_4_) & auVar434._0_4_;
        auVar357._4_4_ = -(uint)(fVar391 <= auVar164._4_4_) & auVar434._4_4_;
        auVar357._8_4_ = -(uint)(fVar397 <= auVar164._8_4_) & auVar434._8_4_;
        auVar357._12_4_ = -(uint)(fVar412 <= auVar164._12_4_) & auVar434._12_4_;
        local_318 = (undefined1  [8])
                    CONCAT44(-(uint)(aVar367.v[1] <= aVar410.v[1]) & auVar434._4_4_,
                             -(uint)(aVar367.v[0] <= aVar410.v[0]) & auVar434._0_4_);
        fStack_310 = (float)(-(uint)(aVar367.v[2] <= aVar410.v[2]) & auVar434._8_4_);
        fStack_30c = (float)(-(uint)(aVar367.v[3] <= aVar410.v[3]) & auVar434._12_4_);
        auVar183._8_4_ = fStack_310;
        auVar183._0_8_ = local_318;
        auVar183._12_4_ = fStack_30c;
        iVar148 = movmskps(iVar148,auVar183 | auVar357);
        pRVar130 = (RTCRayN *)CONCAT44((int)((ulong)pSVar129 >> 0x20),iVar148);
        if (iVar148 != 0) {
          local_338 = local_5ec;
          fStack_334 = local_5ec;
          fStack_330 = local_5ec;
          fStack_32c = local_5ec;
          local_4c8._0_4_ =
               -(uint)((int)local_5ec <
                      ((int)((-(uint)(0.3 <= ABS((float)local_4c8._0_4_ * fVar377 +
                                                 fVar415 * fVar369 + fVar345 * fVar315)) &
                             auVar395._0_4_) << 0x1f) >> 0x1f) + 4);
          local_4c8._4_4_ =
               -(uint)((int)local_5ec <
                      ((int)((-(uint)(0.3 <= ABS((float)local_4c8._4_4_ * fVar377 +
                                                 fVar335 * fVar369 + fVar361 * fVar315)) &
                             auVar395._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_4c0 = (float)-(uint)((int)local_5ec <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_4c0 * fVar377 +
                                                                fVar336 * fVar369 +
                                                                fVar370 * fVar315)) & auVar395._8_4_
                                            ) << 0x1f) >> 0x1f) + 4);
          fStack_4bc = (float)-(uint)((int)local_5ec <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_4bc * fVar377 +
                                                                fVar344 * fVar369 +
                                                                fVar378 * fVar315)) &
                                            auVar395._12_4_) << 0x1f) >> 0x1f) + 4);
          auVar184 = ~_local_4c8 & auVar357;
          fVar404 = local_4b8 + fVar444;
          fVar415 = fStack_4b4 + fVar391;
          fVar438 = fStack_4b0 + fVar397;
          fVar441 = fStack_4ac + fVar412;
          local_328 = auVar357;
          while( true ) {
            local_2b8 = auVar184;
            uVar132 = (undefined4)((ulong)pRVar130 >> 0x20);
            iVar148 = movmskps((int)pRVar130,auVar184);
            pRVar130 = (RTCRayN *)CONCAT44(uVar132,iVar148);
            if (iVar148 == 0) break;
            uVar142 = auVar184._0_4_;
            uVar144 = auVar184._4_4_;
            uVar143 = auVar184._8_4_;
            uVar145 = auVar184._12_4_;
            auVar253._0_4_ = uVar142 & local_4a8._0_4_;
            auVar253._4_4_ = uVar144 & local_4a8._4_4_;
            auVar253._8_4_ = uVar143 & local_4a8._8_4_;
            auVar253._12_4_ = uVar145 & local_4a8._12_4_;
            auVar281._0_8_ = CONCAT44(~uVar144,~uVar142) & 0x7f8000007f800000;
            auVar281._8_4_ = ~uVar143 & 0x7f800000;
            auVar281._12_4_ = ~uVar145 & 0x7f800000;
            auVar281 = auVar281 | auVar253;
            auVar301._4_4_ = auVar281._0_4_;
            auVar301._0_4_ = auVar281._4_4_;
            auVar301._8_4_ = auVar281._12_4_;
            auVar301._12_4_ = auVar281._8_4_;
            auVar164 = minps(auVar301,auVar281);
            auVar254._0_8_ = auVar164._8_8_;
            auVar254._8_4_ = auVar164._0_4_;
            auVar254._12_4_ = auVar164._4_4_;
            auVar164 = minps(auVar254,auVar164);
            auVar255._0_8_ =
                 CONCAT44(-(uint)(auVar164._4_4_ == auVar281._4_4_) & uVar144,
                          -(uint)(auVar164._0_4_ == auVar281._0_4_) & uVar142);
            auVar255._8_4_ = -(uint)(auVar164._8_4_ == auVar281._8_4_) & uVar143;
            auVar255._12_4_ = -(uint)(auVar164._12_4_ == auVar281._12_4_) & uVar145;
            iVar148 = movmskps(iVar148,auVar255);
            if (iVar148 != 0) {
              auVar184._8_4_ = auVar255._8_4_;
              auVar184._0_8_ = auVar255._0_8_;
              auVar184._12_4_ = auVar255._12_4_;
            }
            uVar126 = movmskps(iVar148,auVar184);
            uVar131 = CONCAT44(uVar132,uVar126);
            pRVar130 = (RTCRayN *)0x0;
            if (uVar131 != 0) {
              for (; (uVar131 >> (long)pRVar130 & 1) == 0; pRVar130 = pRVar130 + 1) {
              }
            }
            *(undefined4 *)(local_2b8 + (long)pRVar130 * 4) = 0;
            fVar445 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar447 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar448 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar450 = (ray->super_RayK<1>).dir.field_0.m128[3];
            auVar86._4_4_ = fVar390;
            auVar86._0_4_ = fVar384;
            auVar86._8_4_ = fVar396;
            auVar86._12_4_ = fVar314;
            auVar277 = minps(_local_5c8,auVar86);
            auVar326 = maxps(_local_5c8,auVar86);
            auVar84._4_4_ = fVar323;
            auVar84._0_4_ = fVar322;
            auVar84._8_4_ = fVar343;
            auVar84._12_4_ = fVar312;
            auVar164 = minps(auVar84,_local_548);
            auVar277 = minps(auVar277,auVar164);
            auVar164 = maxps(auVar84,_local_548);
            auVar326 = maxps(auVar326,auVar164);
            auVar302._0_8_ = auVar277._0_8_ & 0x7fffffff7fffffff;
            auVar302._8_4_ = auVar277._8_4_ & 0x7fffffff;
            auVar302._12_4_ = auVar277._12_4_ & 0x7fffffff;
            auVar185._0_8_ = auVar326._0_8_ & 0x7fffffff7fffffff;
            auVar185._8_4_ = auVar326._8_4_ & 0x7fffffff;
            auVar185._12_4_ = ABS(auVar326._12_4_);
            auVar164 = maxps(auVar302,auVar185);
            fVar451 = auVar164._4_4_;
            if (auVar164._4_4_ <= auVar164._0_4_) {
              fVar451 = auVar164._0_4_;
            }
            auVar303._8_8_ = auVar164._8_8_;
            auVar303._0_8_ = auVar164._8_8_;
            if (auVar164._8_4_ <= fVar451) {
              auVar303._0_4_ = fVar451;
            }
            fVar335 = auVar303._0_4_ * 1.9073486e-06;
            fVar451 = *(float *)(local_108 + (long)pRVar130 * 4);
            fVar453 = local_118[(long)(pRVar130 + -8)];
            fVar336 = 0.0;
            fVar344 = 0.0;
            lVar138 = 5;
            do {
              bVar139 = lVar138 == 0;
              lVar138 = lVar138 + -1;
              if (bVar139) goto LAB_00397a80;
              fVar360 = SQRT(fVar448 * fVar448 + fVar447 * fVar447 + fVar445 * fVar445) *
                        1.9073486e-06 * fVar453;
              fVar345 = 1.0 - fVar451;
              fVar347 = fVar384 * fVar345 + fVar322 * fVar451;
              fVar359 = fVar390 * fVar345 + fVar323 * fVar451;
              fVar361 = fVar396 * fVar345 + fVar343 * fVar451;
              fVar378 = fVar314 * fVar345 + fVar312 * fVar451;
              fVar370 = ((float)local_5c8._0_4_ * fVar345 + fVar384 * fVar451) * fVar345 +
                        fVar451 * fVar347;
              fVar379 = ((float)local_5c8._4_4_ * fVar345 + fVar390 * fVar451) * fVar345 +
                        fVar451 * fVar359;
              fVar380 = (fStack_5c0 * fVar345 + fVar396 * fVar451) * fVar345 + fVar451 * fVar361;
              fVar346 = (fStack_5bc * fVar345 + fVar314 * fVar451) * fVar345 + fVar451 * fVar378;
              fVar386 = fVar347 * fVar345 +
                        (fVar322 * fVar345 + (float)local_548._0_4_ * fVar451) * fVar451;
              fVar392 = fVar359 * fVar345 +
                        (fVar323 * fVar345 + (float)local_548._4_4_ * fVar451) * fVar451;
              fVar389 = fVar361 * fVar345 + (fVar343 * fVar345 + fStack_540 * fVar451) * fVar451;
              fVar347 = fVar378 * fVar345 + (fVar312 * fVar345 + fStack_53c * fVar451) * fVar451;
              fVar385 = fVar345 * fVar346 + fVar451 * fVar347;
              fVar388 = (fVar386 - fVar370) * 3.0;
              fVar387 = (fVar392 - fVar379) * 3.0;
              fVar393 = (fVar389 - fVar380) * 3.0;
              fVar398 = (fVar347 - fVar346) * 3.0;
              fVar346 = fVar345 * 6.0;
              fVar378 = (fVar451 - (fVar345 + fVar345)) * 6.0;
              fVar381 = (fVar345 - (fVar451 + fVar451)) * 6.0;
              fVar361 = fVar451 * 6.0;
              fVar347 = fVar346 * (float)local_5c8._0_4_ +
                        fVar378 * fVar384 + fVar381 * fVar322 + fVar361 * (float)local_548._0_4_;
              fVar359 = fVar346 * (float)local_5c8._4_4_ +
                        fVar378 * fVar390 + fVar381 * fVar323 + fVar361 * (float)local_548._4_4_;
              fVar346 = fVar346 * fStack_5c0 +
                        fVar378 * fVar396 + fVar381 * fVar343 + fVar361 * fStack_540;
              fVar361 = (fVar453 * fVar445 + 0.0) - (fVar345 * fVar370 + fVar451 * fVar386);
              fVar370 = (fVar453 * fVar447 + 0.0) - (fVar345 * fVar379 + fVar451 * fVar392);
              fVar378 = (fVar453 * fVar448 + 0.0) - (fVar345 * fVar380 + fVar451 * fVar389);
              fVar379 = (fVar453 * fVar450 + 0.0) - fVar385;
              fVar345 = fVar370 * fVar370;
              fStack_380 = fVar378 * fVar378;
              fStack_37c = fVar379 * fVar379;
              local_388._0_4_ = fVar345 + fVar361 * fVar361 + fStack_380;
              local_388._4_4_ = fVar345 + fVar345 + fStack_37c;
              fStack_380 = fVar345 + fStack_380 + fStack_380;
              fStack_37c = fVar345 + fStack_37c + fStack_37c;
              fVar345 = fVar335;
              if (fVar335 <= fVar360) {
                fVar345 = fVar360;
              }
              fVar380 = fVar387 * fVar387 + fVar388 * fVar388 + fVar393 * fVar393;
              auVar164 = ZEXT416((uint)fVar380);
              auVar277 = rsqrtss(ZEXT416((uint)fVar380),auVar164);
              fVar360 = auVar277._0_4_;
              fVar381 = fVar360 * 1.5 - fVar360 * fVar360 * fVar380 * 0.5 * fVar360;
              fVar424 = fVar388 * fVar381;
              fVar413 = fVar387 * fVar381;
              fVar425 = fVar393 * fVar381;
              fVar416 = fVar398 * fVar381;
              fVar401 = fVar393 * fVar346 + fVar387 * fVar359 + fVar388 * fVar347;
              auVar164 = rcpss(auVar164,auVar164);
              fVar360 = (2.0 - fVar380 * auVar164._0_4_) * auVar164._0_4_;
              fVar386 = fVar370 * fVar413;
              fVar392 = fVar378 * fVar425;
              fVar389 = fVar379 * fVar416;
              fVar403 = fVar386 + fVar361 * fVar424 + fVar392;
              fVar405 = fVar386 + fVar386 + fVar389;
              fVar392 = fVar386 + fVar392 + fVar392;
              fVar389 = fVar386 + fVar389 + fVar389;
              fVar386 = (SQRT((float)local_388._0_4_) + 1.0) * (fVar335 / SQRT(fVar380)) +
                        SQRT((float)local_388._0_4_) * fVar335 + fVar345;
              fVar428 = fVar416 * -fVar398;
              fVar360 = fVar425 * -fVar393 + fVar413 * -fVar387 + fVar424 * -fVar388 +
                        fVar360 * (fVar380 * fVar346 - fVar401 * fVar393) * fVar381 * fVar378 +
                        fVar360 * (fVar380 * fVar359 - fVar401 * fVar387) * fVar381 * fVar370 +
                        fVar360 * (fVar380 * fVar347 - fVar401 * fVar388) * fVar381 * fVar361;
              fVar359 = fVar448 * fVar425 + fVar447 * fVar413 + fVar445 * fVar424;
              fVar346 = (float)local_388._0_4_ - fVar403 * fVar403;
              auVar186._0_8_ = CONCAT44((float)local_388._4_4_ - fVar405 * fVar405,fVar346);
              auVar186._8_4_ = fStack_380 - fVar392 * fVar392;
              auVar186._12_4_ = fStack_37c - fVar389 * fVar389;
              fVar380 = -fVar398 * fVar379;
              auVar256._8_4_ = auVar186._8_4_;
              auVar256._0_8_ = auVar186._0_8_;
              auVar256._12_4_ = auVar186._12_4_;
              auVar164 = rsqrtss(auVar256,auVar186);
              fVar347 = auVar164._0_4_;
              fVar347 = fVar347 * 1.5 - fVar347 * fVar347 * fVar346 * 0.5 * fVar347;
              local_498 = fVar453;
              fStack_494 = fVar451;
              fStack_490 = fVar336;
              fStack_48c = fVar344;
              if (fVar346 < 0.0) {
                fVar346 = sqrtf(fVar346);
                pRVar130 = extraout_RAX;
                pRVar135 = extraout_RDX;
              }
              else {
                fVar346 = SQRT(fVar346);
              }
              fVar346 = fVar346 - fVar385;
              fVar451 = ((-fVar393 * fVar378 + -fVar387 * fVar370 + -fVar388 * fVar361) -
                        fVar403 * fVar360) * fVar347 - fVar398;
              fVar347 = ((fVar448 * fVar378 + fVar447 * fVar370 + fVar445 * fVar361) -
                        fVar403 * fVar359) * fVar347;
              auVar331._4_4_ = fVar428;
              auVar331._0_4_ = fVar360;
              auVar304._0_4_ = fVar360 * fVar347 - fVar359 * fVar451;
              auVar319._8_4_ = -fVar380;
              auVar319._0_8_ = CONCAT44(fVar380,fVar451) ^ 0x8000000000000000;
              auVar319._12_4_ = fVar450 * fVar379;
              auVar318._8_8_ = auVar319._8_8_;
              auVar318._0_8_ = CONCAT44(fVar347,fVar451) ^ 0x80000000;
              auVar304._4_4_ = auVar304._0_4_;
              auVar304._8_4_ = auVar304._0_4_;
              auVar304._12_4_ = auVar304._0_4_;
              auVar164 = divps(auVar318,auVar304);
              auVar331._8_4_ = fVar428;
              auVar331._12_4_ = -(fVar450 * fVar416);
              auVar330._8_8_ = auVar331._8_8_;
              auVar330._0_8_ = CONCAT44(fVar359,fVar360) ^ 0x8000000000000000;
              auVar277 = divps(auVar330,auVar304);
              fVar453 = local_498 - (fVar346 * auVar277._0_4_ + fVar403 * auVar164._0_4_);
              fVar451 = fStack_494 - (fVar346 * auVar277._4_4_ + fVar403 * auVar164._4_4_);
              fVar336 = fStack_490 - (fVar346 * auVar277._8_4_ + fVar403 * auVar164._8_4_);
              fVar344 = fStack_48c - (fVar346 * auVar277._12_4_ + fVar403 * auVar164._12_4_);
            } while ((fVar386 <= ABS(fVar403)) ||
                    (auVar326._12_4_ * 1.9073486e-06 + fVar345 + fVar386 <= ABS(fVar346)));
            fVar453 = local_2f8._0_4_ + fVar453;
            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar453) &&
               (((fVar445 = (ray->super_RayK<1>).tfar, fVar453 <= fVar445 && (0.0 <= fVar451)) &&
                (fVar451 <= 1.0)))) {
              auVar164 = rsqrtss(_local_388,_local_388);
              fVar447 = auVar164._0_4_;
              pGVar26 = (context->scene->geometries).items[uVar140].ptr;
              uVar142 = (ray->super_RayK<1>).mask;
              pRVar130 = (RTCRayN *)(ulong)uVar142;
              if ((pGVar26->mask & uVar142) != 0) {
                fVar447 = fVar447 * 1.5 +
                          fVar447 * fVar447 * (float)local_388._0_4_ * -0.5 * fVar447;
                fVar361 = fVar361 * fVar447;
                fVar370 = fVar370 * fVar447;
                fVar378 = fVar378 * fVar447;
                fVar447 = fVar398 * fVar361 + fVar388;
                fVar448 = fVar398 * fVar370 + fVar387;
                fVar450 = fVar398 * fVar378 + fVar393;
                fVar336 = fVar370 * fVar388 - fVar387 * fVar361;
                fVar344 = fVar378 * fVar387 - fVar393 * fVar370;
                fVar345 = fVar361 * fVar393 - fVar388 * fVar378;
                fVar335 = fVar448 * fVar344 - fVar345 * fVar447;
                uVar200 = CONCAT44(fVar447 * fVar336 - fVar344 * fVar450,
                                   fVar450 * fVar345 - fVar336 * fVar448);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar26->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar453;
                  *(undefined8 *)&(ray->Ng).field_0 = uVar200;
                  (ray->Ng).field_0.field_0.z = fVar335;
                  ray->u = fVar451;
                  ray->v = 0.0;
                  ray->primID = uVar141;
                  ray->geomID = uVar140;
                  ray->instID[0] = context->user->instID[0];
                  uVar142 = context->user->instPrimID[0];
                  ray->instPrimID[0] = uVar142;
                  pRVar130 = (RTCRayN *)(ulong)uVar142;
                }
                else {
                  vu0.field_0._0_8_ = uVar200;
                  vu0.field_0.v[2] = fVar335;
                  vu0.field_0.v[3] = fVar451;
                  pRVar133 = (RTCIntersectArguments *)(ulong)context->user->instID[0];
                  (ray->super_RayK<1>).tfar = fVar453;
                  local_348._0_4_ = 0xffffffff;
                  args.geometryUserPtr = pGVar26->userPtr;
                  args.valid = (int *)local_348;
                  args.context = context->user;
                  args.hit = (RTCHitN *)&vu0;
                  args.N = 1;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar26->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00397b87:
                    pRVar133 = context->args;
                    if ((pRVar133->filter != (RTCFilterFunctionN)0x0) &&
                       (((pRVar133->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                      (*pRVar133->filter)(&args);
                      pRVar135 = extraout_RDX_01;
                      if (*args.valid == 0) goto LAB_00397c16;
                    }
                    *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                    *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                    *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                    *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                    *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
                    *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                    *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                    pRVar135 = (RTCIntersectArguments *)(ulong)*(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0x4c) = *(uint *)(args.hit + 0x1c);
                    pRVar133 = (RTCIntersectArguments *)(ulong)*(uint *)(args.hit + 0x20);
                    *(uint *)(args.ray + 0x50) = *(uint *)(args.hit + 0x20);
                    pRVar130 = args.ray;
                  }
                  else {
                    (*pGVar26->intersectionFilterN)(&args);
                    pRVar135 = extraout_RDX_00;
                    if (*args.valid != 0) goto LAB_00397b87;
LAB_00397c16:
                    (ray->super_RayK<1>).tfar = fVar445;
                    pRVar130 = (RTCRayN *)args.valid;
                  }
                }
              }
            }
LAB_00397a80:
            fVar445 = (ray->super_RayK<1>).tfar;
            auVar184._0_4_ = -(uint)(fVar404 <= fVar445) & local_2b8._0_4_;
            auVar184._4_4_ = -(uint)(fVar415 <= fVar445) & local_2b8._4_4_;
            auVar184._8_4_ = -(uint)(fVar438 <= fVar445) & local_2b8._8_4_;
            auVar184._12_4_ = -(uint)(fVar441 <= fVar445) & local_2b8._12_4_;
          }
          fVar404 = (ray->super_RayK<1>).tfar;
          auVar305._0_4_ = -(uint)(aVar367.v[0] + local_4b8 <= fVar404) & local_318._0_4_;
          auVar305._4_4_ = -(uint)(aVar367.v[1] + fStack_4b4 <= fVar404) & local_318._4_4_;
          auVar305._8_4_ = -(uint)(aVar367.v[2] + fStack_4b0 <= fVar404) & (uint)fStack_310;
          auVar305._12_4_ = -(uint)(aVar367.v[3] + fStack_4ac <= fVar404) & (uint)fStack_30c;
          auVar257._0_4_ =
               -(uint)((int)local_338 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_578._0_4_ * fVar315 +
                                                 auVar317._0_4_ * fVar369 + fVar400 * fVar377)) &
                             auVar395._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar257._4_4_ =
               -(uint)((int)fStack_334 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_578._4_4_ * fVar315 +
                                                 auVar317._4_4_ * fVar369 + fVar402 * fVar377)) &
                             auVar395._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar257._8_4_ =
               -(uint)((int)fStack_330 <
                      ((int)((-(uint)(0.3 <= ABS(fStack_570 * fVar315 +
                                                 auVar317._8_4_ * fVar369 + fVar426 * fVar377)) &
                             auVar395._8_4_) << 0x1f) >> 0x1f) + 4);
          auVar257._12_4_ =
               -(uint)((int)fStack_32c <
                      ((int)((-(uint)(0.3 <= ABS(fStack_56c * fVar315 +
                                                 auVar317._12_4_ * fVar369 + fVar435 * fVar377)) &
                             auVar395._12_4_) << 0x1f) >> 0x1f) + 4);
          auVar258 = ~auVar257 & auVar305;
          _local_4a8 = tp1.lower.field_0;
          fVar315 = local_4b8 + tp1.lower.field_0.v[0];
          fVar369 = fStack_4b4 + tp1.lower.field_0.v[1];
          fVar377 = fStack_4b0 + tp1.lower.field_0.v[2];
          fVar415 = fStack_4ac + tp1.lower.field_0.v[3];
          while( true ) {
            local_348 = auVar258;
            iVar148 = movmskps((int)pRVar130,auVar258);
            if (iVar148 == 0) break;
            auVar277 = ~auVar258 & _DAT_01f45a30 | auVar258 & (undefined1  [16])_local_4a8;
            auVar306._4_4_ = auVar277._0_4_;
            auVar306._0_4_ = auVar277._4_4_;
            auVar306._8_4_ = auVar277._12_4_;
            auVar306._12_4_ = auVar277._8_4_;
            auVar164 = minps(auVar306,auVar277);
            auVar187._0_8_ = auVar164._8_8_;
            auVar187._8_4_ = auVar164._0_4_;
            auVar187._12_4_ = auVar164._4_4_;
            auVar164 = minps(auVar187,auVar164);
            auVar188._0_8_ =
                 CONCAT44(-(uint)(auVar164._4_4_ == auVar277._4_4_) & auVar258._4_4_,
                          -(uint)(auVar164._0_4_ == auVar277._0_4_) & auVar258._0_4_);
            auVar188._8_4_ = -(uint)(auVar164._8_4_ == auVar277._8_4_) & auVar258._8_4_;
            auVar188._12_4_ = -(uint)(auVar164._12_4_ == auVar277._12_4_) & auVar258._12_4_;
            iVar148 = movmskps(iVar148,auVar188);
            if (iVar148 != 0) {
              auVar258._8_4_ = auVar188._8_4_;
              auVar258._0_8_ = auVar188._0_8_;
              auVar258._12_4_ = auVar188._12_4_;
            }
            uVar132 = movmskps(iVar148,auVar258);
            uVar131 = CONCAT44((int)((ulong)pRVar130 >> 0x20),uVar132);
            pRVar130 = (RTCRayN *)0x0;
            if (uVar131 != 0) {
              for (; (uVar131 >> (long)pRVar130 & 1) == 0; pRVar130 = pRVar130 + 1) {
              }
            }
            *(undefined4 *)(local_348 + (long)pRVar130 * 4) = 0;
            fVar404 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar400 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar402 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar426 = (ray->super_RayK<1>).dir.field_0.m128[3];
            auVar87._4_4_ = fVar390;
            auVar87._0_4_ = fVar384;
            auVar87._8_4_ = fVar396;
            auVar87._12_4_ = fVar314;
            auVar277 = minps(_local_5c8,auVar87);
            auVar326 = maxps(_local_5c8,auVar87);
            auVar85._4_4_ = fVar323;
            auVar85._0_4_ = fVar322;
            auVar85._8_4_ = fVar343;
            auVar85._12_4_ = fVar312;
            auVar164 = minps(auVar85,_local_548);
            auVar277 = minps(auVar277,auVar164);
            auVar164 = maxps(auVar85,_local_548);
            auVar326 = maxps(auVar326,auVar164);
            auVar307._0_8_ = auVar277._0_8_ & 0x7fffffff7fffffff;
            auVar307._8_4_ = auVar277._8_4_ & 0x7fffffff;
            auVar307._12_4_ = auVar277._12_4_ & 0x7fffffff;
            auVar189._0_8_ = auVar326._0_8_ & 0x7fffffff7fffffff;
            auVar189._8_4_ = auVar326._8_4_ & 0x7fffffff;
            auVar189._12_4_ = ABS(auVar326._12_4_);
            auVar164 = maxps(auVar307,auVar189);
            fVar435 = auVar164._4_4_;
            if (auVar164._4_4_ <= auVar164._0_4_) {
              fVar435 = auVar164._0_4_;
            }
            auVar308._8_8_ = auVar164._8_8_;
            auVar308._0_8_ = auVar164._8_8_;
            if (auVar164._8_4_ <= fVar435) {
              auVar308._0_4_ = fVar435;
            }
            fVar441 = auVar308._0_4_ * 1.9073486e-06;
            fVar435 = local_118[(long)pRVar130];
            fVar438 = tp1.upper.field_0.v[(long)pRVar130];
            lVar138 = 5;
            do {
              bVar139 = lVar138 == 0;
              lVar138 = lVar138 + -1;
              if (bVar139) goto LAB_00398431;
              fVar451 = SQRT(fVar402 * fVar402 + fVar400 * fVar400 + fVar404 * fVar404) *
                        1.9073486e-06 * fVar438;
              fVar445 = 1.0 - fVar435;
              fVar448 = fVar384 * fVar445 + fVar322 * fVar435;
              fVar450 = fVar390 * fVar445 + fVar323 * fVar435;
              fVar453 = fVar396 * fVar445 + fVar343 * fVar435;
              fVar336 = fVar314 * fVar445 + fVar312 * fVar435;
              fVar335 = ((float)local_5c8._0_4_ * fVar445 + fVar384 * fVar435) * fVar445 +
                        fVar435 * fVar448;
              fVar344 = ((float)local_5c8._4_4_ * fVar445 + fVar390 * fVar435) * fVar445 +
                        fVar435 * fVar450;
              fVar345 = (fStack_5c0 * fVar445 + fVar396 * fVar435) * fVar445 + fVar435 * fVar453;
              fVar447 = (fStack_5bc * fVar445 + fVar314 * fVar435) * fVar445 + fVar435 * fVar336;
              fVar347 = fVar448 * fVar445 +
                        (fVar322 * fVar445 + (float)local_548._0_4_ * fVar435) * fVar435;
              fVar359 = fVar450 * fVar445 +
                        (fVar323 * fVar445 + (float)local_548._4_4_ * fVar435) * fVar435;
              fVar361 = fVar453 * fVar445 + (fVar343 * fVar445 + fStack_540 * fVar435) * fVar435;
              fVar448 = fVar336 * fVar445 + (fVar312 * fVar445 + fStack_53c * fVar435) * fVar435;
              fVar360 = fVar445 * fVar447 + fVar435 * fVar448;
              local_498 = (fVar347 - fVar335) * 3.0;
              fStack_494 = (fVar359 - fVar344) * 3.0;
              fStack_490 = (fVar361 - fVar345) * 3.0;
              fStack_48c = (fVar448 - fVar447) * 3.0;
              fVar447 = fVar445 * 6.0;
              fVar336 = (fVar435 - (fVar445 + fVar445)) * 6.0;
              fVar346 = (fVar445 - (fVar435 + fVar435)) * 6.0;
              fVar453 = fVar435 * 6.0;
              fVar448 = fVar447 * (float)local_5c8._0_4_ +
                        fVar336 * fVar384 + fVar346 * fVar322 + fVar453 * (float)local_548._0_4_;
              fVar450 = fVar447 * (float)local_5c8._4_4_ +
                        fVar336 * fVar390 + fVar346 * fVar323 + fVar453 * (float)local_548._4_4_;
              fVar447 = fVar447 * fStack_5c0 +
                        fVar336 * fVar396 + fVar346 * fVar343 + fVar453 * fStack_540;
              fVar336 = (fVar438 * fVar404 + 0.0) - (fVar445 * fVar335 + fVar435 * fVar347);
              fVar344 = (fVar438 * fVar400 + 0.0) - (fVar445 * fVar344 + fVar435 * fVar359);
              fVar345 = (fVar438 * fVar402 + 0.0) - (fVar445 * fVar345 + fVar435 * fVar361);
              fVar346 = (fVar438 * fVar426 + 0.0) - fVar360;
              fVar445 = fVar344 * fVar344;
              fVar453 = fVar345 * fVar345;
              fVar335 = fVar346 * fVar346;
              fVar347 = fVar445 + fVar336 * fVar336 + fVar453;
              fVar359 = fVar445 + fVar445 + fVar335;
              fVar453 = fVar445 + fVar453 + fVar453;
              fVar335 = fVar445 + fVar335 + fVar335;
              fVar445 = fVar441;
              if (fVar441 <= fVar451) {
                fVar445 = fVar451;
              }
              fVar389 = -local_498;
              fVar393 = -fStack_494;
              fVar398 = -fStack_490;
              fVar361 = fStack_494 * fStack_494 + local_498 * local_498 + fStack_490 * fStack_490;
              auVar164 = ZEXT416((uint)fVar361);
              auVar277 = rsqrtss(ZEXT416((uint)fVar361),auVar164);
              fVar451 = auVar277._0_4_;
              fVar370 = fVar451 * 1.5 - fVar451 * fVar451 * fVar361 * 0.5 * fVar451;
              fVar385 = local_498 * fVar370;
              fVar386 = fStack_494 * fVar370;
              fVar388 = fStack_490 * fVar370;
              fVar392 = fStack_48c * fVar370;
              fVar381 = fStack_490 * fVar447 + fStack_494 * fVar450 + local_498 * fVar448;
              auVar164 = rcpss(auVar164,auVar164);
              fVar451 = (2.0 - fVar361 * auVar164._0_4_) * auVar164._0_4_;
              fVar378 = fVar344 * fVar386;
              fVar379 = fVar345 * fVar388;
              fVar380 = fVar346 * fVar392;
              fVar401 = fVar378 + fVar336 * fVar385 + fVar379;
              fVar403 = fVar378 + fVar378 + fVar380;
              fVar379 = fVar378 + fVar379 + fVar379;
              fVar380 = fVar378 + fVar380 + fVar380;
              fVar378 = (SQRT(fVar347) + 1.0) * (fVar441 / SQRT(fVar361)) +
                        SQRT(fVar347) * fVar441 + fVar445;
              fVar387 = fVar392 * -fStack_48c;
              fVar450 = fVar388 * fVar398 + fVar386 * fVar393 + fVar385 * fVar389 +
                        fVar451 * (fVar361 * fVar447 - fVar381 * fStack_490) * fVar370 * fVar345 +
                        fVar451 * (fVar361 * fVar450 - fVar381 * fStack_494) * fVar370 * fVar344 +
                        fVar451 * (fVar361 * fVar448 - fVar381 * local_498) * fVar370 * fVar336;
              fVar361 = fVar402 * fVar388 + fVar400 * fVar386 + fVar404 * fVar385;
              fVar447 = fVar347 - fVar401 * fVar401;
              auVar423._0_8_ = CONCAT44(fVar359 - fVar403 * fVar403,fVar447);
              auVar423._8_4_ = fVar453 - fVar379 * fVar379;
              auVar423._12_4_ = fVar335 - fVar380 * fVar380;
              fVar451 = -fStack_48c * fVar346;
              auVar259._8_4_ = auVar423._8_4_;
              auVar259._0_8_ = auVar423._0_8_;
              auVar259._12_4_ = auVar423._12_4_;
              auVar164 = rsqrtss(auVar259,auVar423);
              fVar448 = auVar164._0_4_;
              fVar448 = fVar448 * 1.5 - fVar448 * fVar448 * fVar447 * 0.5 * fVar448;
              if (fVar447 < 0.0) {
                fVar447 = sqrtf(fVar447);
                pRVar130 = extraout_RAX_00;
                pRVar135 = extraout_RDX_02;
              }
              else {
                fVar447 = SQRT(fVar447);
              }
              fVar447 = fVar447 - fVar360;
              fVar360 = ((fVar398 * fVar345 + fVar393 * fVar344 + fVar389 * fVar336) -
                        fVar401 * fVar450) * fVar448 - fStack_48c;
              fVar448 = ((fVar402 * fVar345 + fVar400 * fVar344 + fVar404 * fVar336) -
                        fVar401 * fVar361) * fVar448;
              auVar333._4_4_ = fVar387;
              auVar333._0_4_ = fVar450;
              auVar309._0_4_ = fVar450 * fVar448 - fVar361 * fVar360;
              auVar321._8_4_ = -fVar451;
              auVar321._0_8_ = CONCAT44(fVar451,fVar360) ^ 0x8000000000000000;
              auVar321._12_4_ = fVar426 * fVar346;
              auVar320._8_8_ = auVar321._8_8_;
              auVar320._0_8_ = CONCAT44(fVar448,fVar360) ^ 0x80000000;
              auVar309._4_4_ = auVar309._0_4_;
              auVar309._8_4_ = auVar309._0_4_;
              auVar309._12_4_ = auVar309._0_4_;
              auVar164 = divps(auVar320,auVar309);
              auVar333._8_4_ = fVar387;
              auVar333._12_4_ = -(fVar426 * fVar392);
              auVar332._8_8_ = auVar333._8_8_;
              auVar332._0_8_ = CONCAT44(fVar361,fVar450) ^ 0x8000000000000000;
              auVar277 = divps(auVar332,auVar309);
              fVar438 = fVar438 - (fVar447 * auVar277._0_4_ + fVar401 * auVar164._0_4_);
              fVar435 = fVar435 - (fVar447 * auVar277._4_4_ + fVar401 * auVar164._4_4_);
            } while ((fVar378 <= ABS(fVar401)) ||
                    (auVar326._12_4_ * 1.9073486e-06 + fVar445 + fVar378 <= ABS(fVar447)));
            fVar438 = local_2f8._0_4_ + fVar438;
            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar438) &&
               (((fVar404 = (ray->super_RayK<1>).tfar, fVar438 <= fVar404 && (0.0 <= fVar435)) &&
                (fVar435 <= 1.0)))) {
              auVar83._4_4_ = fVar359;
              auVar83._0_4_ = fVar347;
              auVar83._8_4_ = fVar453;
              auVar83._12_4_ = fVar335;
              auVar164 = rsqrtss(auVar83,auVar83);
              fVar400 = auVar164._0_4_;
              pGVar26 = (context->scene->geometries).items[uVar140].ptr;
              uVar142 = (ray->super_RayK<1>).mask;
              pRVar130 = (RTCRayN *)(ulong)uVar142;
              if ((pGVar26->mask & uVar142) != 0) {
                fVar400 = fVar400 * 1.5 + fVar400 * fVar400 * fVar347 * -0.5 * fVar400;
                fVar336 = fVar336 * fVar400;
                fVar344 = fVar344 * fVar400;
                fVar345 = fVar345 * fVar400;
                fVar400 = fStack_48c * fVar336 + local_498;
                fVar402 = fStack_48c * fVar344 + fStack_494;
                fVar426 = fStack_48c * fVar345 + fStack_490;
                fVar445 = fVar344 * local_498 - fStack_494 * fVar336;
                fVar447 = fVar345 * fStack_494 - fStack_490 * fVar344;
                fVar448 = fVar336 * fStack_490 - local_498 * fVar345;
                fVar441 = fVar402 * fVar447 - fVar448 * fVar400;
                uVar200 = CONCAT44(fVar400 * fVar445 - fVar447 * fVar426,
                                   fVar426 * fVar448 - fVar445 * fVar402);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar26->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar438;
                  *(undefined8 *)&(ray->Ng).field_0 = uVar200;
                  (ray->Ng).field_0.field_0.z = fVar441;
                  ray->u = fVar435;
                  ray->v = 0.0;
                  ray->primID = uVar141;
                  ray->geomID = uVar140;
                  ray->instID[0] = context->user->instID[0];
                  uVar142 = context->user->instPrimID[0];
                  ray->instPrimID[0] = uVar142;
                  pRVar130 = (RTCRayN *)(ulong)uVar142;
                }
                else {
                  vu0.field_0._0_8_ = uVar200;
                  vu0.field_0.v[2] = fVar441;
                  vu0.field_0.v[3] = fVar435;
                  pRVar133 = (RTCIntersectArguments *)(ulong)context->user->instID[0];
                  (ray->super_RayK<1>).tfar = fVar438;
                  local_4cc = -1;
                  args.geometryUserPtr = pGVar26->userPtr;
                  args.valid = &local_4cc;
                  args.context = context->user;
                  args.hit = (RTCHitN *)&vu0;
                  args.N = 1;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar26->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00398545:
                    pRVar133 = context->args;
                    if ((pRVar133->filter != (RTCFilterFunctionN)0x0) &&
                       (((pRVar133->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                      (*pRVar133->filter)(&args);
                      pRVar135 = extraout_RDX_04;
                      if (*args.valid == 0) goto LAB_003985f2;
                    }
                    *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                    *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                    *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                    *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                    *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
                    *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                    *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                    pRVar135 = (RTCIntersectArguments *)(ulong)*(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0x4c) = *(uint *)(args.hit + 0x1c);
                    pRVar133 = (RTCIntersectArguments *)(ulong)*(uint *)(args.hit + 0x20);
                    *(uint *)(args.ray + 0x50) = *(uint *)(args.hit + 0x20);
                    pRVar130 = args.ray;
                  }
                  else {
                    (*pGVar26->intersectionFilterN)(&args);
                    pRVar135 = extraout_RDX_03;
                    if (*args.valid != 0) goto LAB_00398545;
LAB_003985f2:
                    (ray->super_RayK<1>).tfar = fVar404;
                    pRVar130 = (RTCRayN *)args.valid;
                  }
                }
              }
            }
LAB_00398431:
            fVar404 = (ray->super_RayK<1>).tfar;
            auVar258._0_4_ = -(uint)(fVar315 <= fVar404) & local_348._0_4_;
            auVar258._4_4_ = -(uint)(fVar369 <= fVar404) & local_348._4_4_;
            auVar258._8_4_ = -(uint)(fVar377 <= fVar404) & local_348._8_4_;
            auVar258._12_4_ = -(uint)(fVar415 <= fVar404) & local_348._12_4_;
          }
          auVar334._0_4_ =
               local_4c8._0_4_ & local_328._0_4_ & -(uint)(local_4b8 + fVar444 <= fVar404);
          auVar334._4_4_ =
               local_4c8._4_4_ & local_328._4_4_ & -(uint)(fStack_4b4 + fVar391 <= fVar404);
          auVar334._8_4_ =
               (uint)fStack_4c0 & local_328._8_4_ & -(uint)(fStack_4b0 + fVar397 <= fVar404);
          auVar334._12_4_ =
               (uint)fStack_4bc & local_328._12_4_ & -(uint)(fStack_4ac + fVar412 <= fVar404);
          auVar190._0_4_ =
               auVar257._0_4_ & auVar305._0_4_ &
               -(uint)(local_4b8 + tp1.lower.field_0.v[0] <= fVar404);
          auVar190._4_4_ =
               auVar257._4_4_ & auVar305._4_4_ &
               -(uint)(fStack_4b4 + tp1.lower.field_0.v[1] <= fVar404);
          auVar190._8_4_ =
               auVar257._8_4_ & auVar305._8_4_ &
               -(uint)(fStack_4b0 + tp1.lower.field_0.v[2] <= fVar404);
          auVar190._12_4_ =
               auVar257._12_4_ & auVar305._12_4_ &
               -(uint)(fStack_4ac + tp1.lower.field_0.v[3] <= fVar404);
          iVar148 = movmskps(0,auVar190 | auVar334);
          if (iVar148 != 0) {
            stack[(long)pRVar136].valid.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar190 | auVar334);
            stack[(long)pRVar136].tlower.field_0.i[0] =
                 ~auVar334._0_4_ & tp1.lower.field_0.i[0] | (uint)fVar444 & auVar334._0_4_;
            stack[(long)pRVar136].tlower.field_0.i[1] =
                 ~auVar334._4_4_ & tp1.lower.field_0.i[1] | (uint)fVar391 & auVar334._4_4_;
            stack[(long)pRVar136].tlower.field_0.i[2] =
                 ~auVar334._8_4_ & tp1.lower.field_0.i[2] | (uint)fVar397 & auVar334._8_4_;
            stack[(long)pRVar136].tlower.field_0.i[3] =
                 ~auVar334._12_4_ & tp1.lower.field_0.i[3] | (uint)fVar412 & auVar334._12_4_;
            stack[(long)pRVar136].u0 = fVar399;
            stack[(long)pRVar136].u1 = fVar199;
            pRVar133 = (RTCIntersectArguments *)(ulong)((int)local_5ec + 1U);
            stack[(long)pRVar136].depth = (int)local_5ec + 1U;
            pRVar136 = (RTCIntersectArguments *)(ulong)((int)pRVar136 + 1);
          }
        }
      }
    }
    fVar399 = (ray->super_RayK<1>).tfar;
    pRVar134 = pRVar133;
    do {
      pRVar137 = pRVar136;
      iVar148 = (int)pRVar137;
      if (iVar148 == 0) {
        auVar192._4_4_ = -(uint)(fVar270 <= fVar399);
        auVar192._0_4_ = -(uint)(fVar147 <= fVar399);
        auVar192._8_4_ = -(uint)(fVar284 <= fVar399);
        auVar192._12_4_ = -(uint)(fVar198 <= fVar399);
        uVar140 = movmskps((int)pRVar134,auVar192);
        local_2e0 = (ulong)((uint)local_2e0 - 1 & (uint)local_2e0 & uVar140);
        goto LAB_003961c9;
      }
      pRVar134 = (RTCIntersectArguments *)(ulong)(iVar148 - 1U);
      fVar199 = stack[(long)pRVar134].tlower.field_0.v[0];
      fVar315 = stack[(long)pRVar134].tlower.field_0.v[1];
      fVar369 = stack[(long)pRVar134].tlower.field_0.v[2];
      fVar377 = stack[(long)pRVar134].tlower.field_0.v[3];
      args.valid._0_4_ =
           -(uint)(local_4b8 + fVar199 <= fVar399) & stack[(long)pRVar134].valid.field_0.i[0];
      args.valid._4_4_ =
           -(uint)(fStack_4b4 + fVar315 <= fVar399) & stack[(long)pRVar134].valid.field_0.i[1];
      args.geometryUserPtr._0_4_ =
           -(uint)(fStack_4b0 + fVar369 <= fVar399) & stack[(long)pRVar134].valid.field_0.i[2];
      args.geometryUserPtr._4_4_ =
           -(uint)(fStack_4ac + fVar377 <= fVar399) & stack[(long)pRVar134].valid.field_0.i[3];
      uVar142 = movmskps((int)pRVar135,(undefined1  [16])args._0_16_);
      pRVar135 = (RTCIntersectArguments *)(ulong)uVar142;
      pRVar136 = pRVar134;
    } while (uVar142 == 0);
    auVar282._0_4_ = (uint)fVar199 & (uint)args.valid;
    auVar282._4_4_ = (uint)fVar315 & args.valid._4_4_;
    auVar282._8_4_ = (uint)fVar369 & (uint)args.geometryUserPtr;
    auVar282._12_4_ = (uint)fVar377 & args.geometryUserPtr._4_4_;
    auVar310._0_8_ = CONCAT44(~args.valid._4_4_,~(uint)args.valid) & 0x7f8000007f800000;
    auVar310._8_4_ = ~(uint)args.geometryUserPtr & 0x7f800000;
    auVar310._12_4_ = ~args.geometryUserPtr._4_4_ & 0x7f800000;
    auVar310 = auVar310 | auVar282;
    auVar283._4_4_ = auVar310._0_4_;
    auVar283._0_4_ = auVar310._4_4_;
    auVar283._8_4_ = auVar310._12_4_;
    auVar283._12_4_ = auVar310._8_4_;
    auVar164 = minps(auVar283,auVar310);
    auVar260._0_8_ = auVar164._8_8_;
    auVar260._8_4_ = auVar164._0_4_;
    auVar260._12_4_ = auVar164._4_4_;
    auVar164 = minps(auVar260,auVar164);
    auVar261._0_8_ =
         CONCAT44(-(uint)(auVar164._4_4_ == auVar310._4_4_) & args.valid._4_4_,
                  -(uint)(auVar164._0_4_ == auVar310._0_4_) & (uint)args.valid);
    auVar261._8_4_ = -(uint)(auVar164._8_4_ == auVar310._8_4_) & (uint)args.geometryUserPtr;
    auVar261._12_4_ = -(uint)(auVar164._12_4_ == auVar310._12_4_) & args.geometryUserPtr._4_4_;
    iVar194 = movmskps(iVar148 - 1U,auVar261);
    auVar191 = (undefined1  [16])args._0_16_;
    if (iVar194 != 0) {
      auVar191._8_4_ = auVar261._8_4_;
      auVar191._0_8_ = auVar261._0_8_;
      auVar191._12_4_ = auVar261._12_4_;
    }
    pSVar129 = stack + (long)pRVar134;
    uVar142 = movmskps(iVar194,auVar191);
    pRVar133 = (RTCIntersectArguments *)0x0;
    if (uVar142 != 0) {
      for (; (uVar142 >> (long)pRVar133 & 1) == 0;
          pRVar133 = (RTCIntersectArguments *)((long)&pRVar133->flags + 1)) {
      }
    }
    *(undefined4 *)((long)&args.valid + (long)pRVar133 * 4) = 0;
    uVar9 = stack[(long)pRVar134].u0;
    uVar18 = stack[(long)pRVar134].u1;
    local_5ec = (float)stack[(long)pRVar134].depth;
    iVar194 = movmskps(local_5ec,(undefined1  [16])args._0_16_);
    pRVar135 = (RTCIntersectArguments *)(ulong)(iVar148 - 1);
    if (iVar194 != 0) {
      pRVar135 = pRVar137;
    }
    (pSVar129->valid).field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)args._0_16_;
    fVar399 = (float)uVar18 - (float)uVar9;
    vu0.field_0.v[1] = fVar399 * 0.33333334 + (float)uVar9;
    vu0.field_0.v[0] = fVar399 * 0.0 + (float)uVar9;
    vu0.field_0.v[2] = fVar399 * 0.6666667 + (float)uVar9;
    vu0.field_0.v[3] = fVar399 * 1.0 + (float)uVar9;
    fVar399 = vu0.field_0.v[(long)pRVar133];
    fVar199 = *(float *)((long)&vu0.field_0 + (long)pRVar133 * 4 + 4);
    pRVar136 = pRVar135;
  } while( true );
}

Assistant:

static __forceinline void intersect_h(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }